

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O3

bool __thiscall FScanner::ScanString(FScanner *this,bool tokens)

{
  uint uVar1;
  FString *this_00;
  byte *pbVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  BYTE BVar6;
  BYTE BVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  char *pcVar11;
  byte bVar12;
  int iVar13;
  long lVar14;
  byte bVar15;
  int iVar16;
  byte *pbVar17;
  byte *pbVar18;
  byte *pbVar19;
  byte *pbVar20;
  uint uVar21;
  bool bVar22;
  bool bVar23;
  FString FStack_38;
  
  if (this->ScriptOpen == false) {
    I_FatalError("SC_ call before SC_Open().");
  }
  if (this->AlreadyGot == false) {
    pbVar20 = (byte *)this->ScriptPtr;
  }
  else {
    this->AlreadyGot = false;
    if (!tokens) {
      return true;
    }
    if (this->LastGotToken != false) {
      return true;
    }
    pbVar20 = (byte *)this->LastGotPtr;
    this->ScriptPtr = (char *)pbVar20;
    this->Line = this->LastGotLine;
  }
  this->Crossed = false;
  pbVar2 = (byte *)this->ScriptEndPtr;
  if (pbVar2 <= pbVar20) {
    tokens = true;
    lVar14 = 0x28;
    goto LAB_00480bf9;
  }
  this->LastGotPtr = (char *)pbVar20;
  this->LastGotLine = this->Line;
LAB_004803a3:
  iVar8 = (int)pbVar20;
  pbVar19 = pbVar20;
  if (!tokens) {
    if (this->CMode == true) {
      pbVar18 = pbVar20 + 2;
      pbVar17 = pbVar20 + 6;
      lVar14 = 0;
LAB_0048041f:
      bVar12 = pbVar20[lVar14];
      if (0x39 < bVar12) {
        pbVar19 = pbVar20 + lVar14;
        if (bVar12 < 0x5b) {
          if (bVar12 < 0x3d) {
            if (bVar12 == 0x3a) {
              pbVar18 = pbVar20 + lVar14 + 1;
              bVar23 = *pbVar18 == 0x3a;
            }
            else {
              if (bVar12 != 0x3c) goto LAB_00480fad;
              pbVar18 = pbVar20 + lVar14 + 1;
              bVar23 = *pbVar18 == 0x3c;
            }
          }
          else if (bVar12 == 0x3d) {
            pbVar18 = pbVar20 + lVar14 + 1;
            bVar23 = *pbVar18 == 0x3d;
          }
          else {
            if (0x3e < bVar12) {
              if (bVar12 < 0x41) goto LAB_00480fad;
              goto LAB_00485fb4;
            }
            pbVar18 = pbVar20 + lVar14 + 1;
            bVar23 = *pbVar18 == 0x3e;
          }
        }
        else {
          if (bVar12 < 0x7b) {
            if (bVar12 == 0x5f || 0x60 < bVar12) goto LAB_00485fb4;
            goto LAB_00480fad;
          }
          if (bVar12 != 0x7c) {
            if (0x7e < bVar12) goto LAB_00485fb4;
            goto LAB_00480fad;
          }
          pbVar18 = pbVar20 + lVar14 + 1;
          bVar23 = *pbVar18 == 0x7c;
        }
LAB_00480ef1:
        pbVar19 = pbVar20 + lVar14 + 2;
        if (!bVar23) {
          pbVar19 = pbVar18;
        }
        goto LAB_00480fb3;
      }
      if (bVar12 < 0x26) {
        if (bVar12 < 0x21) {
          if (bVar12 == 10) {
            pbVar20 = pbVar20 + lVar14 + 1;
            goto LAB_00480bdb;
          }
          pbVar20 = pbVar20 + lVar14;
          goto LAB_00480a20;
        }
        if (bVar12 == 0x21) goto LAB_00480fad;
        if (bVar12 < 0x23) {
          pbVar20 = pbVar20 + lVar14;
          goto LAB_004816b1;
        }
        if (bVar12 != 0x23) goto LAB_00480fad;
        bVar12 = pbVar20[lVar14 + 1];
        if (bVar12 == 0x65) {
          if ((pbVar20[lVar14 + 2] != 0x6e) || (pbVar20[lVar14 + 3] != 100)) goto LAB_00480fad;
          lVar10 = 4;
          bVar12 = pbVar20[lVar14 + 4];
        }
        else {
          lVar10 = 1;
        }
        if (((((bVar12 == 0x72) && (pbVar20[lVar14 + 1 + lVar10] == 0x65)) &&
             (pbVar20[lVar14 + 2 + lVar10] == 0x67)) &&
            ((pbVar20[lVar14 + 3 + lVar10] == 0x69 && (pbVar20[lVar14 + 4 + lVar10] == 0x6f)))) &&
           (pbVar20[lVar14 + 5 + lVar10] == 0x6e)) {
          pbVar19 = pbVar17 + lVar10;
          do {
            pbVar20 = pbVar19 + 1;
            bVar12 = *pbVar19;
            pbVar19 = pbVar20;
          } while (bVar12 != 10);
          goto LAB_00480bdb;
        }
        goto LAB_00480fad;
      }
      if (bVar12 < 0x2d) {
        if (bVar12 == 0x26) {
          pbVar18 = pbVar20 + lVar14 + 1;
          bVar23 = *pbVar18 == 0x26;
          goto LAB_00480ef1;
        }
        if (0x27 < bVar12) goto LAB_00480fad;
        pbVar19 = pbVar20 + lVar14;
        goto LAB_00485fb4;
      }
      if (bVar12 == 0x2d) {
        pbVar19 = pbVar20 + lVar14 + 1;
        this->TokenType = 0x2d;
        if ((pbVar19 < pbVar2) &&
           (((byte)(*pbVar19 - 0x30) < 10 ||
            (((*pbVar19 == 0x2e && (pbVar20 + lVar14 + 2 < pbVar2)) &&
             ('/' < (char)pbVar20[lVar14 + 2])))))) goto LAB_00480495;
        goto LAB_00485e09;
      }
      if (0x2e < bVar12) {
        if (bVar12 == 0x2f) {
          if (pbVar20[lVar14 + 1] != 0x2a) {
            if (pbVar20[lVar14 + 1] == 0x2f) {
              do {
                pbVar20 = pbVar18 + 1;
                bVar12 = *pbVar18;
                pbVar18 = pbVar20;
              } while (bVar12 != 10);
              goto LAB_00480bdb;
            }
LAB_00480fad:
            pbVar19 = pbVar20 + lVar14 + 1;
            goto LAB_00480fb3;
          }
          pbVar20 = pbVar20 + lVar14 + 2;
          goto LAB_004809af;
        }
        pbVar19 = pbVar20 + lVar14 + 2;
        goto LAB_004811e4;
      }
      pbVar19 = pbVar20 + lVar14 + 1;
      if (9 < (byte)(*pbVar19 - 0x30)) goto LAB_00480fb3;
      goto LAB_0048116c;
    }
    bVar12 = *pbVar20;
    pbVar18 = pbVar20;
    if (0x2e < bVar12) {
      if (bVar12 < 0x3d) {
        if (bVar12 != 0x2f) {
          if (bVar12 != 0x3b) goto LAB_00485f0c;
LAB_00480606:
          pbVar19 = pbVar19 + 1;
          do {
            pbVar20 = pbVar19 + 1;
            bVar12 = *pbVar19;
            pbVar19 = pbVar20;
          } while (bVar12 != 10);
          goto LAB_00480bdb;
        }
        pbVar19 = pbVar20 + 1;
        bVar12 = pbVar20[1];
        pbVar18 = pbVar19;
        if (bVar12 < 0x30) {
          if (0x22 < bVar12) {
            if (bVar12 == 0x2a) goto LAB_004809ab;
            if (bVar12 != 0x2f) goto LAB_00485f0c;
            goto LAB_00480606;
          }
          if (bVar12 == 0x21) goto LAB_00485f0c;
        }
        else if (bVar12 < 0x3d) {
          if (bVar12 != 0x3b) goto LAB_00485f0c;
        }
        else if ((2 < bVar12 - 0x7b) && (bVar12 != 0x3d)) goto LAB_00485f0c;
      }
      else {
        if ((2 < bVar12 - 0x7b) && (bVar12 != 0x3d)) goto LAB_00485f0c;
        pbVar19 = pbVar20 + 1;
      }
LAB_00480fb3:
      if (pbVar2 <= pbVar19) {
        pbVar19 = (byte *)this->ScriptEndPtr;
      }
      this->ScriptPtr = (char *)pbVar19;
      uVar9 = (int)pbVar19 - iVar8;
      this->StringLen = uVar9;
      goto LAB_00485c7a;
    }
    if (bVar12 < 0x21) {
      if (bVar12 == 10) goto switchD_004804f9_caseD_a;
      do {
        pbVar19 = pbVar20 + 1;
        pbVar20 = pbVar20 + 1;
        if (*pbVar19 == 10) break;
      } while (*pbVar19 < 0x21);
      if (0x2e < bVar12) goto LAB_004809af;
      goto LAB_004803a3;
    }
    if (bVar12 == 0x21) goto LAB_00485f0c;
    if (bVar12 < 0x23) {
LAB_004816b1:
      pbVar19 = (byte *)this->ScriptEndPtr;
      if (pbVar2 != pbVar19) goto LAB_00480c50;
      pbVar20 = pbVar20 + 1;
      this->ScriptPtr = (char *)pbVar20;
      this_00 = &this->BigStringBuffer;
      FString::operator=(this_00,(char *)"");
      this->StringLen = 0;
      iVar8 = 0;
      if (pbVar2 <= pbVar20) goto LAB_004817b0;
      goto LAB_004816f1;
    }
    if (bVar12 != 0x23) goto LAB_00485f0c;
    bVar12 = pbVar20[1];
    if (bVar12 == 0x65) {
      bVar12 = pbVar20[2];
      if (bVar12 != 0x6e) {
        pbVar19 = pbVar20 + 2;
        goto LAB_00485f15;
      }
      bVar12 = pbVar20[3];
      if (bVar12 != 100) {
        pbVar19 = pbVar20 + 3;
        goto LAB_00485f15;
      }
      bVar12 = pbVar20[4];
      lVar14 = 4;
      if (bVar12 != 0x72) {
        pbVar19 = pbVar20 + 4;
        goto LAB_00485f15;
      }
    }
    else {
      lVar14 = 1;
      if (bVar12 != 0x72) {
        pbVar19 = pbVar20 + 1;
        goto LAB_00485f15;
      }
    }
    bVar12 = pbVar20[lVar14 + 1];
    if (bVar12 != 0x65) {
      pbVar19 = pbVar20 + lVar14 + 1;
      goto LAB_00485f15;
    }
    bVar12 = pbVar20[lVar14 + 2];
    if (bVar12 != 0x67) {
      pbVar19 = pbVar20 + lVar14 + 2;
      goto LAB_00485f15;
    }
    bVar12 = pbVar20[lVar14 + 3];
    if (bVar12 != 0x69) {
      pbVar19 = pbVar20 + lVar14 + 3;
      goto LAB_00485f15;
    }
    bVar12 = pbVar20[lVar14 + 4];
    if (bVar12 != 0x6f) {
      pbVar19 = pbVar20 + lVar14 + 4;
      goto LAB_00485f15;
    }
    bVar12 = pbVar20[lVar14 + 5];
    pbVar19 = pbVar20 + lVar14 + 5;
    if (bVar12 != 0x6e) goto LAB_00485f15;
LAB_00480807:
    do {
      while( true ) {
        pbVar20 = pbVar19 + 1;
        bVar12 = pbVar19[1];
        if (bVar12 < 0x30) break;
        pbVar19 = pbVar20;
        if (bVar12 < 0x3d) {
joined_r0x0048088a:
          if (bVar12 == 0x3b) goto LAB_00480bb1;
        }
        else {
          if (bVar12 - 0x7b < 3) goto LAB_00480bb1;
joined_r0x004808bd:
          if (bVar12 == 0x3d) goto LAB_00480bb1;
        }
      }
      if (bVar12 < 0x21) goto joined_r0x00480a12;
      if (bVar12 == 0x2f) {
        bVar12 = pbVar19[2];
        pbVar19 = pbVar19 + 2;
        if (0x2e < bVar12) {
          if (bVar12 < 0x3d) {
            if (bVar12 != 0x2f) goto joined_r0x0048088a;
          }
          else if (2 < bVar12 - 0x7b) goto joined_r0x004808bd;
          break;
        }
        pbVar20 = pbVar19;
        if (bVar12 < 0x22) {
          if (bVar12 != 0x21) goto joined_r0x00480a12;
          goto LAB_00480807;
        }
        bVar12 = bVar12 & 0x37;
      }
      pbVar19 = pbVar20;
    } while (bVar12 != 0x22);
LAB_00480bb1:
    do {
      bVar12 = pbVar19[1];
      pbVar20 = pbVar19 + 1;
joined_r0x00480a12:
      pbVar19 = pbVar20;
    } while (bVar12 != 10);
switchD_004804f9_caseD_a:
    pbVar20 = pbVar20 + 1;
LAB_00480bdb:
    if (pbVar2 <= pbVar20) goto LAB_00480c4c;
    this->Line = this->Line + 1;
    this->Crossed = true;
    goto LAB_004803a3;
  }
  bVar12 = *pbVar20;
  if (this->StateMode != '\0') {
    pbVar18 = pbVar20;
    if (0x4c < bVar12) {
      if (0x6b < bVar12) {
        if (0x76 < bVar12) {
          if (bVar12 != 0x77) {
            if (bVar12 != 0x7d) goto LAB_00485ce9;
            this->StateMode = '\0';
            this->StateOptions = false;
            goto LAB_00481810;
          }
          goto LAB_00481033;
        }
        if (bVar12 == 0x6c) goto LAB_00480db8;
        if (bVar12 != 0x73) goto LAB_00485ce9;
LAB_00480d3d:
        bVar12 = pbVar20[1];
        bVar23 = true;
        if ((bVar12 & 0xdf) != 0x54) {
          pbVar19 = pbVar20 + 1;
          goto LAB_00485cfa;
        }
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x4f) {
          pbVar19 = pbVar20 + 2;
          goto LAB_00485cfa;
        }
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x50) {
          pbVar19 = pbVar20 + 3;
          goto LAB_00485cfa;
        }
        pbVar19 = pbVar20 + 4;
        bVar12 = pbVar20[4];
        if (bVar12 < 0x3a) {
          if (0x22 < bVar12 || bVar12 == 0x21) {
LAB_00481090:
            bVar22 = false;
            bVar5 = false;
LAB_00481662:
            pbVar19 = pbVar20 + 4;
            bVar3 = false;
            goto LAB_00485cfd;
          }
        }
        else {
          pbVar18 = pbVar19;
          if (0x3b < bVar12 && bVar12 != 0x7d) goto joined_r0x0048110f;
        }
        goto LAB_00485dba;
      }
      if (bVar12 < 0x58) {
        if (bVar12 == 0x53) goto LAB_00480d3d;
        if (bVar12 != 0x57) goto LAB_00485ce9;
LAB_00481033:
        bVar12 = pbVar20[1];
        if ((bVar12 & 0xdf) != 0x41) {
LAB_00481672:
          pbVar19 = pbVar20 + 1;
          goto LAB_00485cfa;
        }
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x49) goto LAB_00481678;
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) == 0x54) {
          pbVar19 = pbVar20 + 4;
          bVar12 = pbVar20[4];
          if (bVar12 < 0x3a) {
            if (0x22 < bVar12 || bVar12 == 0x21) {
              bVar23 = false;
              goto LAB_00481090;
            }
          }
          else {
            pbVar18 = pbVar19;
            if (0x3b < bVar12 && bVar12 != 0x7d) goto joined_r0x0048110f;
          }
          goto LAB_00485db1;
        }
      }
      else {
        if (bVar12 < 0x66) goto LAB_00485ce9;
        if (bVar12 == 0x66) goto LAB_00480f11;
        if (0x67 < bVar12) goto LAB_00485ce9;
LAB_0048160f:
        bVar12 = pbVar20[1];
        bVar22 = true;
        if ((bVar12 & 0xdf) != 0x4f) goto LAB_00481672;
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x54) goto LAB_00481678;
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) == 0x4f) {
          pbVar19 = pbVar20 + 4;
          bVar12 = pbVar20[4];
          if (bVar12 < 0x3a) {
            if (0x22 < bVar12 || bVar12 == 0x21) {
              bVar5 = false;
              bVar23 = true;
              goto LAB_00481662;
            }
          }
          else {
            pbVar18 = pbVar19;
            if (0x3b < bVar12 && bVar12 != 0x7d) goto joined_r0x0048110f;
          }
          goto LAB_00485dc3;
        }
      }
LAB_0048167e:
      pbVar19 = pbVar20 + 3;
      goto LAB_00485cfa;
    }
    if (0x2f < bVar12) {
      if (bVar12 < 0x46) {
        if (bVar12 < 0x3a) goto LAB_00485ce9;
        if (bVar12 != 0x3a) {
          if (0x3b < bVar12) goto LAB_00485ce9;
          goto LAB_00481901;
        }
        pbVar19 = pbVar20 + 1;
        iVar16 = 0x3a;
        goto LAB_00481a87;
      }
      if (bVar12 == 0x46) {
LAB_00480f11:
        bVar12 = pbVar20[1];
        if ((bVar12 & 0xdf) != 0x41) goto LAB_00481672;
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) == 0x49) {
          bVar12 = pbVar20[3];
          if ((bVar12 & 0xdf) != 0x4c) goto LAB_0048167e;
          pbVar19 = pbVar20 + 4;
          bVar12 = pbVar20[4];
          if (bVar12 < 0x3a) {
            if (0x22 < bVar12 || bVar12 == 0x21) {
              bVar22 = true;
              bVar5 = false;
              bVar23 = true;
              bVar3 = false;
              bVar4 = true;
              goto LAB_00485d00;
            }
          }
          else {
            pbVar18 = pbVar19;
            if (0x3b < bVar12 && bVar12 != 0x7d) goto joined_r0x0048110f;
          }
          goto LAB_00485d95;
        }
      }
      else {
        if (bVar12 < 0x48) goto LAB_0048160f;
        if (bVar12 != 0x4c) goto LAB_00485ce9;
LAB_00480db8:
        bVar12 = pbVar20[1];
        if ((bVar12 & 0xdf) != 0x4f) goto LAB_00481672;
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) == 0x4f) {
          bVar12 = pbVar20[3];
          if ((bVar12 & 0xdf) != 0x50) goto LAB_0048167e;
          pbVar19 = pbVar20 + 4;
          bVar12 = pbVar20[4];
          if (bVar12 < 0x3a) {
            if (0x22 < bVar12 || bVar12 == 0x21) {
              bVar23 = true;
              bVar22 = false;
              bVar5 = true;
              goto LAB_00481662;
            }
          }
          else {
            pbVar18 = pbVar19;
            if (0x3b < bVar12 && bVar12 != 0x7d) goto joined_r0x0048110f;
          }
          goto LAB_00485da8;
        }
      }
LAB_00481678:
      pbVar19 = pbVar20 + 2;
      goto LAB_00485cfa;
    }
    if (0x21 < bVar12) {
      if (bVar12 == 0x22) goto LAB_00480e49;
      if (0x23 < bVar12) {
        if (bVar12 != 0x2f) goto LAB_00485ce9;
        pbVar18 = pbVar20 + 1;
        bVar12 = pbVar20[1];
        if (bVar12 < 0x2f) {
          if (bVar12 < 0x23) goto joined_r0x004810fe;
          if (bVar12 != 0x2a) goto LAB_00485ce9;
          goto LAB_004809ab;
        }
        if (0x3b < bVar12) goto joined_r0x0048110f;
        if (bVar12 != 0x2f) goto joined_r0x004811c6;
        pbVar19 = pbVar20 + 2;
        do {
          pbVar20 = pbVar19 + 1;
          bVar12 = *pbVar19;
          pbVar19 = pbVar20;
        } while (bVar12 != 10);
        goto LAB_00480bdb;
      }
      bVar12 = pbVar20[1];
      if (bVar12 == 0x65) {
        bVar12 = pbVar20[2];
        if (bVar12 != 0x6e) {
          pbVar19 = pbVar20 + 2;
          goto LAB_00485cfa;
        }
        bVar12 = pbVar20[3];
        if (bVar12 != 100) {
          pbVar19 = pbVar20 + 3;
          goto LAB_00485cfa;
        }
        bVar12 = pbVar20[4];
        lVar14 = 4;
        if (bVar12 != 0x72) {
          pbVar19 = pbVar20 + 4;
          goto LAB_00485cfa;
        }
      }
      else {
        lVar14 = 1;
        if (bVar12 != 0x72) {
          pbVar19 = pbVar20 + 1;
          goto LAB_00485cfa;
        }
      }
      bVar12 = pbVar20[lVar14 + 1];
      if (bVar12 == 0x65) {
        bVar12 = pbVar20[lVar14 + 2];
        if (bVar12 == 0x67) {
          bVar12 = pbVar20[lVar14 + 3];
          if (bVar12 == 0x69) {
            bVar12 = pbVar20[lVar14 + 4];
            if (bVar12 == 0x6f) {
              bVar12 = pbVar20[lVar14 + 5];
              pbVar19 = pbVar20 + lVar14 + 5;
              if (bVar12 == 0x6e) {
LAB_004806ab:
                do {
                  while( true ) {
                    pbVar20 = pbVar19 + 1;
                    bVar12 = pbVar19[1];
                    if (0x2e < bVar12) break;
                    if (bVar12 < 0x21) {
LAB_00480bc3:
                      if (bVar12 == 10) goto switchD_004804f9_caseD_a;
                      goto LAB_00480bcb;
                    }
LAB_004806c3:
                    pbVar19 = pbVar20;
                    if (bVar12 == 0x22) goto LAB_00480bcb;
                  }
                  if (0x3b < bVar12) {
LAB_004806f7:
                    pbVar19 = pbVar20;
                    if (bVar12 == 0x7d) break;
                    goto LAB_004806ab;
                  }
                  if (bVar12 == 0x2f) {
                    bVar12 = pbVar19[2];
                    pbVar20 = pbVar19 + 2;
                    if (bVar12 < 0x2b) {
                      if (bVar12 < 0x21) goto LAB_00480bc3;
                      bVar12 = bVar12 & 0x37;
                      goto LAB_004806c3;
                    }
                    if (0x39 < bVar12) {
                      if (0x3b < bVar12) goto LAB_004806f7;
                      break;
                    }
                    pbVar19 = pbVar20;
                    if (bVar12 == 0x2f) break;
                    goto LAB_004806ab;
                  }
                  pbVar19 = pbVar20;
                } while (bVar12 < 0x3a);
LAB_00480bcb:
                do {
                  pbVar19 = pbVar20 + 1;
                  pbVar18 = pbVar20 + 1;
                  pbVar20 = pbVar19;
                } while (*pbVar18 != 10);
                goto switchD_004804f9_caseD_a;
              }
            }
            else {
              pbVar19 = pbVar20 + lVar14 + 4;
            }
          }
          else {
            pbVar19 = pbVar20 + lVar14 + 3;
          }
        }
        else {
          pbVar19 = pbVar20 + lVar14 + 2;
        }
      }
      else {
        pbVar19 = pbVar20 + lVar14 + 1;
      }
      goto LAB_00485cfa;
    }
    if (bVar12 != 10) {
      if (bVar12 == 0x21) goto LAB_00485ce9;
      do {
        pbVar19 = pbVar20 + 1;
        pbVar20 = pbVar20 + 1;
        if (*pbVar19 == 10) break;
      } while (*pbVar19 < 0x21);
      if (0x21 < bVar12) goto LAB_004809af;
      goto LAB_004803a3;
    }
    goto switchD_004804f9_caseD_a;
  }
  switch(bVar12) {
  case 9:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0x20:
    do {
      while( true ) {
        pbVar20 = pbVar20 + 1;
        bVar12 = *pbVar20;
        if (10 < bVar12) break;
        if (bVar12 != 9) goto LAB_004803a3;
      }
    } while (bVar12 == 0x20 || bVar12 < 0xe);
    goto LAB_004803a3;
  case 10:
    goto switchD_004804f9_caseD_a;
  default:
    goto LAB_004809f5;
  case 0x21:
    bVar23 = pbVar20[1] == 0x3d;
    iVar13 = 0x120;
    iVar16 = 0x21;
    goto LAB_00481a7a;
  case 0x22:
LAB_004819fe:
    do {
      pbVar18 = pbVar19 + 1;
      pbVar19 = pbVar19 + 1;
      bVar12 = *pbVar18;
      while (bVar12 == 0x5c) {
        while (pbVar18 = pbVar19 + 1, *pbVar18 != 0x22) {
          pbVar19 = pbVar19 + 1;
          if (*pbVar18 != 0x5c) goto LAB_004819fe;
        }
        pbVar18 = pbVar19 + 2;
        pbVar19 = pbVar19 + 2;
        bVar12 = *pbVar18;
      }
    } while (bVar12 != 0x22);
    goto LAB_00480e77;
  case 0x23:
    bVar15 = pbVar20[1];
    if (bVar15 < 0x66) {
      if (bVar15 == 0x49) {
LAB_00480ac8:
        if (((((pbVar20[2] & 0xdf) == 0x4e) && ((pbVar20[3] & 0xdf) == 0x43)) &&
            ((pbVar20[4] & 0xdf) == 0x4c)) &&
           ((((pbVar20[5] & 0xdf) == 0x55 && ((pbVar20[6] & 0xdf) == 0x44)) &&
            ((pbVar20[7] & 0xdf) == 0x45)))) {
          pbVar19 = pbVar20 + 8;
          iVar16 = 0x177;
          break;
        }
      }
      else if (((bVar15 == 0x65) && (pbVar20[2] == 0x6e)) && (pbVar20[3] == 100)) {
        lVar14 = 4;
        bVar15 = pbVar20[4];
        goto joined_r0x00480b4a;
      }
    }
    else if (bVar15 < 0x6a) {
      if (bVar15 == 0x69) goto LAB_00480ac8;
    }
    else {
      lVar14 = 1;
joined_r0x00480b4a:
      if (((((bVar15 == 0x72) && (pbVar20[lVar14 + 1] == 0x65)) && (pbVar20[lVar14 + 2] == 0x67)) &&
          ((pbVar20[lVar14 + 3] == 0x69 && (pbVar20[lVar14 + 4] == 0x6f)))) &&
         (pbVar20[lVar14 + 5] == 0x6e)) {
        pbVar19 = pbVar20 + lVar14 + 6;
        do {
          pbVar20 = pbVar19 + 1;
          bVar12 = *pbVar19;
          pbVar19 = pbVar20;
        } while (bVar12 != 10);
        goto LAB_00480bdb;
      }
    }
    goto LAB_004809f5;
  case 0x25:
    bVar23 = pbVar20[1] == 0x3d;
    iVar13 = 0x112;
    iVar16 = 0x25;
    goto LAB_00481a7a;
  case 0x26:
    if (pbVar20[1] == 0x26) {
      pbVar19 = pbVar20 + 2;
      iVar16 = 0x11b;
    }
    else if (pbVar20[1] == 0x3d) {
      pbVar19 = pbVar20 + 2;
      iVar16 = 0x113;
    }
    else {
      pbVar19 = pbVar20 + 1;
      iVar16 = 0x26;
    }
    break;
  case 0x27:
    bVar15 = pbVar20[1];
    if (bVar15 != 10) {
      pbVar19 = pbVar20 + 2;
      while (bVar15 != 10) {
        if (bVar15 == 0x27) {
          this->TokenType = 0x103;
          goto LAB_00485e09;
        }
        bVar15 = *pbVar19;
        pbVar19 = pbVar19 + 1;
      }
    }
LAB_004809f5:
    pbVar20 = pbVar20 + 1;
    ScriptError(this,"Unexpected character: %c (ASCII %d)\n",(ulong)(uint)(int)(char)bVar12);
    goto LAB_004803a3;
  case 0x28:
    pbVar19 = pbVar20 + 1;
    iVar16 = 0x28;
    break;
  case 0x29:
    pbVar19 = pbVar20 + 1;
    iVar16 = 0x29;
    break;
  case 0x2a:
    if (pbVar20[1] == 0x2a) {
      pbVar19 = pbVar20 + 2;
      iVar16 = 0x123;
    }
    else if (pbVar20[1] == 0x3d) {
      pbVar19 = pbVar20 + 2;
      iVar16 = 0x110;
    }
    else {
      pbVar19 = pbVar20 + 1;
      iVar16 = 0x2a;
    }
    break;
  case 0x2b:
    if (pbVar20[1] == 0x2b) {
      pbVar19 = pbVar20 + 2;
      iVar16 = 0x119;
    }
    else if (pbVar20[1] == 0x3d) {
      pbVar19 = pbVar20 + 2;
      iVar16 = 0x10e;
    }
    else {
      pbVar19 = pbVar20 + 1;
      iVar16 = 0x2b;
    }
    break;
  case 0x2c:
    pbVar19 = pbVar20 + 1;
    iVar16 = 0x2c;
    break;
  case 0x2d:
    bVar12 = pbVar20[1];
    if (bVar12 < 0x3d) {
      bVar23 = bVar12 == 0x2d;
      iVar13 = 0x11a;
      iVar16 = 0x2d;
      goto LAB_00481a7a;
    }
    if (bVar12 == 0x3d) {
      pbVar19 = pbVar20 + 2;
      iVar16 = 0x10f;
    }
    else {
      iVar16 = 0x2d;
      if (bVar12 < 0x3f) {
        iVar16 = 0x124;
      }
      pbVar19 = pbVar20 + 1;
      if (bVar12 < 0x3f) {
        pbVar19 = pbVar20 + 2;
      }
    }
    break;
  case 0x2e:
    if (pbVar20[1] == 0x2e) {
      pbVar19 = pbVar20 + 2;
      if (pbVar20[2] == 0x2e) {
        pbVar19 = pbVar20 + 3;
      }
      iVar16 = (pbVar20[2] == 0x2e) + 0x109;
    }
    else {
      pbVar19 = pbVar20 + 1;
      iVar16 = 0x2e;
      if ((byte)(pbVar20[1] - 0x30) < 10) goto LAB_0048112c;
    }
    break;
  case 0x2f:
    bVar12 = pbVar20[1];
    pbVar19 = pbVar20 + 1;
    if (bVar12 < 0x2f) {
      if (bVar12 == 0x2a) {
LAB_004809ab:
        pbVar20 = pbVar20 + 2;
        goto LAB_004809af;
      }
      iVar16 = 0x2f;
    }
    else {
      if (bVar12 == 0x2f) {
        pbVar19 = pbVar20 + 2;
        do {
          pbVar20 = pbVar19 + 1;
          bVar12 = *pbVar19;
          pbVar19 = pbVar20;
        } while (bVar12 != 10);
        goto LAB_00480bdb;
      }
      iVar16 = 0x2f;
      if (bVar12 == 0x3d) {
        pbVar19 = pbVar20 + 2;
        iVar16 = 0x111;
      }
    }
    break;
  case 0x30:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    if (bVar12 < 0x56) {
      if (0x44 < bVar12) {
        if (bVar12 < 0x4c) {
          bVar23 = true;
          if (bVar12 != 0x45) goto LAB_004843c8;
          goto LAB_00482956;
        }
        pbVar18 = pbVar19;
        if (bVar12 != 0x4c) goto LAB_004810c7;
        goto LAB_004843aa;
      }
      if (bVar12 < 0x2f) {
        if (bVar12 != 0x2e) goto LAB_004843c8;
        goto LAB_0048112c;
      }
      if (bVar12 == 0x2f || 0x39 < bVar12) goto LAB_004843c8;
      goto LAB_00480ead;
    }
    if (bVar12 < 0x6c) {
      if (0x58 < bVar12) {
        bVar23 = true;
        if (bVar12 != 0x65) goto LAB_004843c8;
        goto LAB_00482956;
      }
      if (bVar12 != 0x58) goto LAB_004843c8;
    }
    else {
      if (bVar12 < 0x76) goto LAB_00482f14;
      if (bVar12 != 0x78) goto LAB_004843c8;
    }
    bVar12 = pbVar20[2];
    if (bVar12 < 0x41) {
      if (9 < (byte)(bVar12 - 0x30)) goto LAB_004843c8;
    }
    else if (5 < (byte)(bVar12 + 0x9f) && 0x46 < bVar12) goto LAB_004843c8;
    pbVar19 = pbVar20 + 3;
    goto LAB_0048436a;
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    goto LAB_00480ead;
  case 0x3a:
    bVar23 = pbVar20[1] == 0x3a;
    iVar13 = 0x108;
    iVar16 = 0x3a;
    goto LAB_00481a7a;
  case 0x3b:
    this->StateOptions = false;
LAB_00481901:
    pbVar19 = pbVar20 + 1;
    iVar16 = 0x3b;
    break;
  case 0x3c:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    iVar16 = 0x3c;
    if (bVar12 < 0x3c) break;
    if (bVar12 != 0x3c) {
      if (bVar12 < 0x3e) {
        pbVar19 = pbVar20 + 2;
        iVar16 = 0x11d;
      }
      else if (bVar12 == 0x3e) {
        bVar23 = pbVar20[2] == 0x3d;
        iVar13 = 0x122;
        iVar16 = 0x3c;
        goto LAB_00481ae7;
      }
      break;
    }
    pbVar19 = pbVar20 + 2;
    bVar23 = pbVar20[2] == 0x3d;
    iVar13 = 0x10d;
    iVar16 = 0x118;
LAB_00481ae7:
    if (bVar23) {
      iVar16 = iVar13;
    }
    pbVar18 = pbVar20 + 3;
    goto LAB_00481a81;
  case 0x3d:
    bVar23 = pbVar20[1] == 0x3d;
    iVar13 = 0x11f;
    iVar16 = 0x3d;
    goto LAB_00481a7a;
  case 0x3e:
    bVar12 = pbVar20[1];
    pbVar19 = pbVar20 + 1;
    iVar16 = 0x3e;
    if (0x3c < bVar12) {
      if (bVar12 == 0x3d) {
        pbVar19 = pbVar20 + 2;
        iVar16 = 0x11e;
      }
      else if (bVar12 < 0x3f) {
        bVar12 = pbVar20[2];
        pbVar19 = pbVar20 + 2;
        iVar16 = 0x116;
        if (0x3c < bVar12) {
          if (bVar12 == 0x3d) {
            pbVar19 = pbVar20 + 3;
            iVar16 = 0x10b;
          }
          else if (bVar12 < 0x3f) {
            pbVar19 = pbVar20 + 3;
            bVar23 = pbVar20[3] == 0x3d;
            iVar16 = 0x117;
            if (bVar23) {
              iVar16 = 0x10c;
            }
            pbVar18 = pbVar20 + 4;
            goto LAB_00481a81;
          }
        }
      }
    }
    break;
  case 0x3f:
    pbVar19 = pbVar20 + 1;
    iVar16 = 0x3f;
    break;
  case 0x41:
  case 0x61:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    if (bVar12 < 0x56) {
      if (bVar12 < 0x4c) {
        if (bVar12 < 0x42) goto switchD_004813bb_caseD_4a;
        if (bVar12 != 0x42) {
          if (0x43 < bVar12) goto switchD_004813bb_caseD_4a;
LAB_00483988:
          bVar12 = pbVar20[2];
          if ((bVar12 & 0xdf) != 0x54) goto LAB_004839e6;
          bVar12 = pbVar20[3];
          if ((bVar12 & 0xdf) != 0x49) goto LAB_004846f5;
          bVar12 = pbVar20[4];
          if ((bVar12 & 0xdf) != 0x4f) goto LAB_00485073;
          bVar12 = pbVar20[5];
          if ((bVar12 & 0xdf) != 0x4e) goto LAB_0048513d;
          pbVar19 = pbVar20 + 6;
          bVar12 = pbVar20[6];
          if (bVar12 < 0x5b) {
            bVar23 = 0x2f < bVar12;
            bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
LAB_0048566d:
            if ((bool)(bVar23 & bVar22)) goto LAB_00485dd5;
          }
          else {
            if (0x5f < bVar12) {
              bVar23 = bVar12 != 0x60;
              bVar22 = bVar12 < 0x7b;
              goto LAB_0048566d;
            }
            if (bVar12 == 0x5f) goto LAB_00485dd5;
          }
          iVar16 = 0x125;
          break;
        }
LAB_00481c56:
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x53) goto LAB_004839e6;
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x54) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x52) goto LAB_00485073;
        bVar12 = pbVar20[5];
        if ((bVar12 & 0xdf) != 0x41) goto LAB_0048513d;
        bVar12 = pbVar20[6];
        if ((bVar12 & 0xdf) != 0x43) goto LAB_0048507c;
        bVar12 = pbVar20[7];
        if ((bVar12 & 0xdf) != 0x54) goto LAB_00485085;
        pbVar19 = pbVar20 + 8;
        bVar12 = pbVar20[8];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
LAB_004859c7:
          if ((bool)(bVar23 & bVar22)) goto LAB_00485dd5;
        }
        else {
          if (0x5f < bVar12) {
            bVar23 = bVar12 != 0x60;
            bVar22 = bVar12 < 0x7b;
            goto LAB_004859c7;
          }
          if (bVar12 == 0x5f) goto LAB_00485dd5;
        }
        iVar16 = 0x14e;
        break;
      }
      if (bVar12 < 0x52) {
        if (bVar12 != 0x4c) goto switchD_004813bb_caseD_4a;
        goto LAB_004830d1;
      }
      if (bVar12 == 0x52) goto LAB_004834e0;
      if (bVar12 != 0x55) goto switchD_004813bb_caseD_4a;
LAB_0048315f:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x54) goto LAB_004839e6;
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x4f) goto LAB_004846f5;
      pbVar19 = pbVar20 + 4;
      bVar12 = pbVar20[4];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
LAB_00484d67:
        if ((bool)(bVar23 & bVar22)) goto LAB_00485dd5;
      }
      else {
        if (0x5f < bVar12) {
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
          goto LAB_00484d67;
        }
        if (bVar12 == 0x5f) goto LAB_00485dd5;
      }
      iVar16 = 0x155;
    }
    else {
      if (bVar12 < 0x6d) {
        if (bVar12 < 99) {
          if (bVar12 != 0x62) goto switchD_004813bb_caseD_4a;
          goto LAB_00481c56;
        }
        if (bVar12 == 99) goto LAB_00483988;
        if (bVar12 != 0x6c) goto switchD_004813bb_caseD_4a;
LAB_004830d1:
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x49) goto LAB_004839e6;
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x47) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x4e) goto LAB_00485073;
        bVar12 = pbVar20[5];
        if ((bVar12 & 0xdf) != 0x4f) goto LAB_0048513d;
        bVar12 = pbVar20[6];
        if ((bVar12 & 0xdf) != 0x46) goto LAB_0048507c;
        pbVar19 = pbVar20 + 7;
        bVar12 = pbVar20[7];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
LAB_004857ee:
          if ((bool)(bVar23 & bVar22)) goto LAB_00485dd5;
        }
        else {
          if (0x5f < bVar12) {
            bVar23 = bVar12 != 0x60;
            bVar22 = bVar12 < 0x7b;
            goto LAB_004857ee;
          }
          if (bVar12 == 0x5f) goto LAB_00485dd5;
        }
        iVar16 = 0x180;
        break;
      }
      if (0x72 < bVar12) {
        if (bVar12 != 0x75) goto switchD_004813bb_caseD_4a;
        goto LAB_0048315f;
      }
      if (bVar12 != 0x72) goto switchD_004813bb_caseD_4a;
LAB_004834e0:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x52) goto LAB_004839e6;
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x41) goto LAB_004846f5;
      bVar12 = pbVar20[4];
      if ((bVar12 & 0xdf) != 0x59) goto LAB_00485073;
      pbVar19 = pbVar20 + 5;
      bVar12 = pbVar20[5];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
LAB_004851cd:
        if ((bool)(bVar23 & bVar22)) goto LAB_00485dd5;
      }
      else {
        if (0x5f < bVar12) {
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
          goto LAB_004851cd;
        }
        if (bVar12 == 0x5f) goto LAB_00485dd5;
      }
      iVar16 = 0x17d;
    }
    break;
  case 0x42:
  case 0x62:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    if (bVar12 < 0x5a) {
      if (0x51 < bVar12) {
        if (bVar12 != 0x52) {
          if (bVar12 != 0x59) goto switchD_004813bb_caseD_4a;
          goto LAB_004823f8;
        }
LAB_00482bfe:
        pbVar19 = pbVar20 + 2;
        bVar12 = pbVar20[2];
        if (bVar12 < 0x4a) {
          if (bVar12 == 0x45) {
LAB_00483740:
            bVar12 = pbVar20[3];
            if ((bVar12 & 0xdf) != 0x41) goto LAB_004846f5;
            bVar12 = pbVar20[4];
            if ((bVar12 & 0xdf) != 0x4b) goto LAB_00485073;
            pbVar19 = pbVar20 + 5;
            bVar12 = pbVar20[5];
            if (bVar12 < 0x5b) {
              bVar23 = 0x2f < bVar12;
              bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
LAB_0048523e:
              if ((bool)(bVar23 & bVar22)) goto LAB_00485dd5;
            }
            else {
              if (0x5f < bVar12) {
                bVar23 = bVar12 != 0x60;
                bVar22 = bVar12 < 0x7b;
                goto LAB_0048523e;
              }
              if (bVar12 == 0x5f) goto LAB_00485dd5;
            }
            iVar16 = 0x126;
            break;
          }
          if (bVar12 != 0x49) goto switchD_004813bb_caseD_4a;
        }
        else {
          if (bVar12 < 0x66) {
            if (bVar12 != 0x65) goto switchD_004813bb_caseD_4a;
            goto LAB_00483740;
          }
          if (bVar12 != 0x69) goto switchD_004813bb_caseD_4a;
        }
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x47) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x48) goto LAB_00485073;
        bVar12 = pbVar20[5];
        if ((bVar12 & 0xdf) != 0x54) {
LAB_0048513d:
          pbVar19 = pbVar20 + 5;
          goto switchD_004813bb_caseD_4a;
        }
        pbVar19 = pbVar20 + 6;
        bVar12 = pbVar20[6];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
LAB_00485486:
          if ((bool)(bVar23 & bVar22)) goto LAB_00485dd5;
        }
        else {
          if (0x5f < bVar12) {
            bVar23 = bVar12 != 0x60;
            bVar22 = bVar12 < 0x7b;
            goto LAB_00485486;
          }
          if (bVar12 == 0x5f) goto LAB_00485dd5;
        }
        bVar23 = this->StateOptions == false;
        iVar13 = 0x18e;
LAB_00485a2a:
        iVar16 = 0x101;
        if (!bVar23) {
          iVar16 = iVar13;
        }
        break;
      }
      if (bVar12 != 0x4f) goto switchD_004813bb_caseD_4a;
LAB_00481d58:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x4f) goto LAB_004839e6;
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x4c) goto LAB_004846f5;
      pbVar19 = pbVar20 + 4;
      bVar12 = pbVar20[4];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
LAB_004847e5:
        if ((bool)(bVar23 & bVar22)) goto LAB_00485dd5;
      }
      else {
        if (0x5f < bVar12) {
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
          goto LAB_004847e5;
        }
        if (bVar12 == 0x5f) goto LAB_00485dd5;
      }
      iVar16 = 0x133;
    }
    else {
      if (bVar12 < 0x72) {
        if (bVar12 != 0x6f) goto switchD_004813bb_caseD_4a;
        goto LAB_00481d58;
      }
      if (bVar12 == 0x72) goto LAB_00482bfe;
      if (bVar12 != 0x79) goto switchD_004813bb_caseD_4a;
LAB_004823f8:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x54) goto LAB_004839e6;
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x45) goto LAB_004846f5;
      pbVar19 = pbVar20 + 4;
      bVar12 = pbVar20[4];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
LAB_00484a96:
        if ((bool)(bVar23 & bVar22)) goto LAB_00485dd5;
      }
      else {
        if (0x5f < bVar12) {
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
          goto LAB_00484a96;
        }
        if (bVar12 == 0x5f) goto LAB_00485dd5;
      }
      iVar16 = 0x138;
    }
    break;
  case 0x43:
  case 99:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    if (0x60 < bVar12) {
      if (bVar12 < 0x6c) {
        if (bVar12 == 0x61) goto LAB_00482ac3;
        if (bVar12 != 0x68) goto switchD_004813bb_caseD_4a;
LAB_00482a4c:
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x41) goto LAB_004839e6;
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x52) goto LAB_004846f5;
        pbVar19 = pbVar20 + 4;
        bVar12 = pbVar20[4];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x137;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x137;
      }
      else if (bVar12 == 0x6c) {
LAB_00482aec:
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x41) goto LAB_004839e6;
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x53) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x53) goto LAB_00485073;
        pbVar19 = pbVar20 + 5;
        bVar12 = pbVar20[5];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x146;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x146;
      }
      else {
        if (bVar12 == 0x6f) goto LAB_00482b3e;
        if (bVar12 != 0x72) goto switchD_004813bb_caseD_4a;
LAB_00481bab:
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x4f) goto LAB_004839e6;
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x53) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x53) goto LAB_00485073;
        pbVar19 = pbVar20 + 5;
        bVar12 = pbVar20[5];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x167;
joined_r0x00484a16:
            pbVar19 = pbVar20 + 5;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x167;
      }
      goto LAB_00485c16;
    }
    if (bVar12 < 0x4c) {
      if (bVar12 != 0x41) {
        if (bVar12 != 0x48) goto switchD_004813bb_caseD_4a;
        goto LAB_00482a4c;
      }
LAB_00482ac3:
      pbVar19 = pbVar20 + 2;
      bVar12 = pbVar20[2];
      if (bVar12 < 0x54) {
        if (bVar12 == 0x4e) {
LAB_004835a9:
          bVar12 = pbVar20[3];
          if ((bVar12 & 0xdf) != 0x52) goto LAB_004846f5;
          bVar12 = pbVar20[4];
          if ((bVar12 & 0xdf) != 0x41) goto LAB_00485073;
          bVar12 = pbVar20[5];
          if ((bVar12 & 0xdf) != 0x49) goto LAB_0048513d;
          bVar12 = pbVar20[6];
          if ((bVar12 & 0xdf) != 0x53) goto LAB_0048507c;
          bVar12 = pbVar20[7];
          if ((bVar12 & 0xdf) != 0x45) goto LAB_00485085;
          pbVar19 = pbVar20 + 8;
          bVar12 = pbVar20[8];
          if (bVar12 < 0x5b) {
            bVar23 = 0x2f < bVar12;
            bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
LAB_00485a13:
            if ((bool)(bVar23 & bVar22)) goto LAB_00485dd5;
          }
          else {
            if (0x5f < bVar12) {
              bVar23 = bVar12 != 0x60;
              bVar22 = bVar12 < 0x7b;
              goto LAB_00485a13;
            }
            if (bVar12 == 0x5f) goto LAB_00485dd5;
          }
          bVar23 = this->StateOptions == false;
          iVar13 = 0x188;
          goto LAB_00485a2a;
        }
        if (bVar12 != 0x53) goto switchD_004813bb_caseD_4a;
      }
      else {
        if (bVar12 < 0x6f) {
          if (bVar12 != 0x6e) goto switchD_004813bb_caseD_4a;
          goto LAB_004835a9;
        }
        if (bVar12 != 0x73) goto switchD_004813bb_caseD_4a;
      }
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x45) goto LAB_004846f5;
      pbVar19 = pbVar20 + 4;
      bVar12 = pbVar20[4];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
LAB_00484d35:
        if ((bool)(bVar23 & bVar22)) goto LAB_00485dd5;
      }
      else {
        if (0x5f < bVar12) {
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
          goto LAB_00484d35;
        }
        if (bVar12 == 0x5f) goto LAB_00485dd5;
      }
      iVar16 = 0x127;
      break;
    }
    if (bVar12 == 0x4c) goto LAB_00482aec;
    if (bVar12 != 0x4f) {
      if (bVar12 != 0x52) goto switchD_004813bb_caseD_4a;
      goto LAB_00481bab;
    }
LAB_00482b3e:
    pbVar19 = pbVar20 + 2;
    bVar12 = pbVar20[2];
    if (bVar12 < 0x4f) {
      if (bVar12 < 0x4c) {
        if (bVar12 != 0x45) goto switchD_004813bb_caseD_4a;
        goto LAB_0048362d;
      }
      if (bVar12 == 0x4c) goto LAB_00484414;
      if (bVar12 != 0x4e) goto switchD_004813bb_caseD_4a;
    }
    else {
      if (bVar12 < 0x6c) {
        if (bVar12 != 0x65) goto switchD_004813bb_caseD_4a;
LAB_0048362d:
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x52) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x43) goto LAB_00485073;
        bVar12 = pbVar20[5];
        if ((bVar12 & 0xdf) != 0x45) goto LAB_0048513d;
        pbVar19 = pbVar20 + 6;
        bVar12 = pbVar20[6];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x16d;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x16d;
        goto LAB_00485c16;
      }
      if (bVar12 == 0x6c) {
LAB_00484414:
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x4f) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x52) goto LAB_00485073;
        pbVar19 = pbVar20 + 5;
        bVar12 = pbVar20[5];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x14c;
            goto joined_r0x00484a16;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x14c;
        goto LAB_00485c16;
      }
      if (bVar12 != 0x6e) goto switchD_004813bb_caseD_4a;
    }
    pbVar19 = pbVar20 + 3;
    bVar12 = pbVar20[3];
    if (bVar12 < 0x55) {
      bVar23 = bVar12 == 0x46;
      if (bVar12 < 0x47) {
LAB_0048481d:
        if (!bVar23) goto switchD_004813bb_caseD_4a;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x49) goto LAB_00485073;
        bVar12 = pbVar20[5];
        if ((bVar12 & 0xdf) != 0x47) goto LAB_0048513d;
        pbVar19 = pbVar20 + 6;
        bVar12 = pbVar20[6];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x16c;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x16c;
        goto LAB_00485c16;
      }
      if (bVar12 < 0x53) goto switchD_004813bb_caseD_4a;
      if (bVar12 == 0x54) {
LAB_0048501d:
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x49) goto LAB_00485073;
        bVar12 = pbVar20[5];
        if ((bVar12 & 0xdf) != 0x4e) goto LAB_0048513d;
        bVar12 = pbVar20[6];
        if ((bVar12 & 0xdf) != 0x55) goto LAB_0048507c;
        bVar12 = pbVar20[7];
        if ((bVar12 & 0xdf) != 0x45) goto LAB_00485085;
        pbVar19 = pbVar20 + 8;
        bVar12 = pbVar20[8];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x129;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x129;
        goto LAB_00485c16;
      }
    }
    else {
      if (bVar12 < 0x73) {
        bVar23 = bVar12 == 0x66;
        goto LAB_0048481d;
      }
      if (bVar12 != 0x73) {
        if (0x74 < bVar12) goto switchD_004813bb_caseD_4a;
        goto LAB_0048501d;
      }
    }
    bVar12 = pbVar20[4];
    if ((bVar12 & 0xdf) != 0x54) goto LAB_00485073;
    pbVar19 = pbVar20 + 5;
    bVar12 = pbVar20[5];
    if (bVar12 < 0x5b) {
      bVar23 = 0x2f < bVar12;
      bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
    }
    else {
      if (bVar12 < 0x60) {
        iVar16 = 0x128;
        goto joined_r0x004855f0;
      }
      bVar23 = bVar12 != 0x60;
      bVar22 = bVar12 < 0x7b;
    }
    iVar16 = 0x128;
    goto LAB_00485c16;
  case 0x44:
  case 100:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    if (bVar12 < 0x50) {
      if (bVar12 == 0x45) goto LAB_00481b2a;
      if (bVar12 != 0x4f) goto switchD_004813bb_caseD_4a;
    }
    else {
      if (bVar12 < 0x66) {
        if (bVar12 != 0x65) goto switchD_004813bb_caseD_4a;
LAB_00481b2a:
        pbVar19 = pbVar20 + 2;
        bVar12 = pbVar20[2];
        if (bVar12 < 0x51) {
          if (bVar12 != 0x46) {
            if (bVar12 != 0x50) goto switchD_004813bb_caseD_4a;
            goto LAB_004838dd;
          }
        }
        else {
          if (0x66 < bVar12) {
            if (bVar12 != 0x70) goto switchD_004813bb_caseD_4a;
LAB_004838dd:
            bVar12 = pbVar20[3];
            if ((bVar12 & 0xdf) != 0x52) goto LAB_004846f5;
            bVar12 = pbVar20[4];
            if ((bVar12 & 0xdf) != 0x45) goto LAB_00485073;
            bVar12 = pbVar20[5];
            if ((bVar12 & 0xdf) != 0x43) goto LAB_0048513d;
            bVar12 = pbVar20[6];
            if ((bVar12 & 0xdf) != 0x41) goto LAB_0048507c;
            bVar12 = pbVar20[7];
            if ((bVar12 & 0xdf) != 0x54) goto LAB_00485085;
            bVar12 = pbVar20[8];
            if ((bVar12 & 0xdf) != 0x45) goto LAB_004855ae;
            bVar12 = pbVar20[9];
            if ((bVar12 & 0xdf) != 0x44) goto LAB_00485614;
            pbVar19 = pbVar20 + 10;
            bVar12 = pbVar20[10];
            if (bVar12 < 0x5b) {
              bVar23 = 0x2f < bVar12;
              bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
            }
            else {
              if (bVar12 < 0x60) {
                iVar16 = 0x186;
                goto joined_r0x004855f0;
              }
              bVar23 = bVar12 != 0x60;
              bVar22 = bVar12 < 0x7b;
            }
            iVar16 = 0x186;
            goto LAB_00485c16;
          }
          if (bVar12 != 0x66) goto switchD_004813bb_caseD_4a;
        }
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x41) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x55) goto LAB_00485073;
        bVar12 = pbVar20[5];
        if ((bVar12 & 0xdf) != 0x4c) goto LAB_0048513d;
        bVar12 = pbVar20[6];
        if ((bVar12 & 0xdf) != 0x54) goto LAB_0048507c;
        pbVar19 = pbVar20 + 7;
        bVar12 = pbVar20[7];
        if (bVar12 < 0x5b) {
          if (bVar12 < 0x41) {
            bVar12 = bVar12 - 0x30;
            iVar16 = 0x12a;
            goto LAB_00483259;
          }
          if (bVar12 != 0x50) goto LAB_00485dd5;
        }
        else {
          if (bVar12 < 0x61) {
            iVar16 = 0x12a;
            goto joined_r0x004855f0;
          }
          if (bVar12 != 0x70) {
            iVar16 = 0x12a;
            goto LAB_00484b63;
          }
        }
        bVar12 = pbVar20[8];
        if ((bVar12 & 0xdf) != 0x52) goto LAB_004855ae;
        bVar12 = pbVar20[9];
        if ((bVar12 & 0xdf) != 0x4f) {
LAB_00485614:
          pbVar19 = pbVar20 + 9;
          goto switchD_004813bb_caseD_4a;
        }
        bVar12 = pbVar20[10];
        if ((bVar12 & 0xdf) != 0x50) {
          pbVar19 = pbVar20 + 10;
          goto switchD_004813bb_caseD_4a;
        }
        bVar12 = pbVar20[0xb];
        if ((bVar12 & 0xdf) != 0x45) {
          pbVar19 = pbVar20 + 0xb;
          goto switchD_004813bb_caseD_4a;
        }
        bVar12 = pbVar20[0xc];
        if ((bVar12 & 0xdf) != 0x52) {
          pbVar19 = pbVar20 + 0xc;
          goto switchD_004813bb_caseD_4a;
        }
        bVar12 = pbVar20[0xd];
        if ((bVar12 & 0xdf) != 0x54) {
          pbVar19 = pbVar20 + 0xd;
          goto switchD_004813bb_caseD_4a;
        }
        bVar12 = pbVar20[0xe];
        if ((bVar12 & 0xdf) != 0x49) {
          pbVar19 = pbVar20 + 0xe;
          goto switchD_004813bb_caseD_4a;
        }
        bVar12 = pbVar20[0xf];
        if ((bVar12 & 0xdf) != 0x45) {
          pbVar19 = pbVar20 + 0xf;
          goto switchD_004813bb_caseD_4a;
        }
        bVar12 = pbVar20[0x10];
        if ((bVar12 & 0xdf) != 0x53) {
          pbVar19 = pbVar20 + 0x10;
          goto switchD_004813bb_caseD_4a;
        }
        pbVar19 = pbVar20 + 0x11;
        bVar12 = pbVar20[0x11];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x157;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x157;
        goto LAB_00485c16;
      }
      if (bVar12 != 0x6f) goto switchD_004813bb_caseD_4a;
    }
    pbVar19 = pbVar20 + 2;
    bVar12 = pbVar20[2];
    if (bVar12 < 0x5b) {
      if (0x40 < bVar12) {
        if (0x53 < bVar12) {
          if (bVar12 == 0x54) {
LAB_004838b2:
            pbVar19 = pbVar20 + 3;
            bVar12 = pbVar20[3];
            if (bVar12 < 0x5b) {
              bVar23 = 0x2f < bVar12;
              bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
            }
            else {
              if (bVar12 < 0x60) {
                iVar16 = 0x166;
                goto joined_r0x004855f0;
              }
              bVar23 = bVar12 != 0x60;
              bVar22 = bVar12 < 0x7b;
            }
            iVar16 = 0x166;
            goto LAB_00485c16;
          }
          if (bVar12 < 0x56) goto LAB_004841ab;
        }
        goto LAB_00485dd5;
      }
      bVar12 = bVar12 - 0x30;
      iVar16 = 299;
LAB_00483259:
      if (bVar12 < 10) goto LAB_00485dd5;
    }
    else {
      if (0x73 < bVar12) {
        if (bVar12 == 0x74) goto LAB_004838b2;
        if (0x75 < bVar12) {
          iVar16 = 299;
          goto LAB_00484b63;
        }
LAB_004841ab:
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x42) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x4c) goto LAB_00485073;
        bVar12 = pbVar20[5];
        if ((bVar12 & 0xdf) != 0x45) goto LAB_0048513d;
        pbVar19 = pbVar20 + 6;
        bVar12 = pbVar20[6];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x136;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x136;
        goto LAB_00485c16;
      }
      iVar16 = 299;
      if (0x60 < bVar12 || bVar12 == 0x5f) goto LAB_00485dd5;
    }
    break;
  case 0x45:
  case 0x65:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    if (bVar12 < 0x6c) {
      if (bVar12 < 0x56) {
        if (bVar12 != 0x4c) {
          if (bVar12 != 0x4e) goto switchD_004813bb_caseD_4a;
          goto LAB_00481db5;
        }
LAB_004827e5:
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x53) goto LAB_004839e6;
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x45) goto LAB_004846f5;
        pbVar19 = pbVar20 + 4;
        bVar12 = pbVar20[4];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 300;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 300;
      }
      else {
        if (bVar12 != 0x56) {
          if (bVar12 != 0x58) goto switchD_004813bb_caseD_4a;
          goto LAB_0048245f;
        }
LAB_00482827:
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x45) goto LAB_004839e6;
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x4e) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x54) goto LAB_00485073;
        pbVar19 = pbVar20 + 5;
        bVar12 = pbVar20[5];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x15c;
joined_r0x00484b7f:
            pbVar19 = pbVar20 + 5;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x15c;
      }
    }
    else if (bVar12 < 0x76) {
      if (bVar12 == 0x6c) goto LAB_004827e5;
      if (bVar12 != 0x6e) goto switchD_004813bb_caseD_4a;
LAB_00481db5:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x55) goto LAB_004839e6;
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x4d) goto LAB_004846f5;
      pbVar19 = pbVar20 + 4;
      bVar12 = pbVar20[4];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
      }
      else {
        if (bVar12 < 0x60) {
          iVar16 = 0x147;
          goto joined_r0x004855f0;
        }
        bVar23 = bVar12 != 0x60;
        bVar22 = bVar12 < 0x7b;
      }
      iVar16 = 0x147;
    }
    else {
      if (bVar12 == 0x76) goto LAB_00482827;
      if (bVar12 != 0x78) goto switchD_004813bb_caseD_4a;
LAB_0048245f:
      pbVar19 = pbVar20 + 2;
      bVar12 = pbVar20[2];
      if (bVar12 < 0x55) {
        if (0x4f < bVar12) {
          if (bVar12 == 0x50) {
LAB_00484150:
            bVar12 = pbVar20[3];
            if ((bVar12 & 0xdf) != 0x4f) goto LAB_004846f5;
            bVar12 = pbVar20[4];
            if ((bVar12 & 0xdf) != 0x52) goto LAB_00485073;
            bVar12 = pbVar20[5];
            if ((bVar12 & 0xdf) != 0x54) goto LAB_0048513d;
            pbVar19 = pbVar20 + 6;
            bVar12 = pbVar20[6];
            if (bVar12 < 0x5b) {
              bVar23 = 0x2f < bVar12;
              bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
            }
            else {
              if (bVar12 < 0x60) {
                iVar16 = 0x170;
                goto joined_r0x004855f0;
              }
              bVar23 = bVar12 != 0x60;
              bVar22 = bVar12 < 0x7b;
            }
            iVar16 = 0x170;
            goto LAB_00485c16;
          }
          if (bVar12 != 0x54) goto switchD_004813bb_caseD_4a;
LAB_00483df7:
          bVar12 = pbVar20[3];
          if ((bVar12 & 0xdf) != 0x45) goto LAB_004846f5;
          bVar12 = pbVar20[4];
          if ((bVar12 & 0xdf) != 0x4e) goto LAB_00485073;
          bVar12 = pbVar20[5];
          if ((bVar12 & 0xdf) != 0x44) goto LAB_0048513d;
          pbVar19 = pbVar20 + 6;
          bVar12 = pbVar20[6];
          if (bVar12 < 0x5b) {
            bVar23 = 0x2f < bVar12;
            bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
          }
          else {
            if (bVar12 < 0x60) {
              iVar16 = 0x162;
              goto joined_r0x004855f0;
            }
            bVar23 = bVar12 != 0x60;
            bVar22 = bVar12 < 0x7b;
          }
          iVar16 = 0x162;
          goto LAB_00485c16;
        }
        if (bVar12 != 0x45) goto switchD_004813bb_caseD_4a;
      }
      else {
        if (0x6f < bVar12) {
          if (bVar12 == 0x70) goto LAB_00484150;
          if (bVar12 != 0x74) goto switchD_004813bb_caseD_4a;
          goto LAB_00483df7;
        }
        if (bVar12 != 0x65) goto switchD_004813bb_caseD_4a;
      }
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x43) goto LAB_004846f5;
      pbVar19 = pbVar20 + 4;
      bVar12 = pbVar20[4];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
      }
      else {
        if (bVar12 < 0x60) {
          iVar16 = 0x156;
          goto joined_r0x004855f0;
        }
        bVar23 = bVar12 != 0x60;
        bVar22 = bVar12 < 0x7b;
      }
      iVar16 = 0x156;
    }
    goto LAB_00485c16;
  case 0x46:
  case 0x66:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    if (bVar12 < 0x50) {
      if (0x49 < bVar12) {
        if (bVar12 != 0x4c) {
          if (bVar12 != 0x4f) goto switchD_004813bb_caseD_4a;
          goto LAB_00483227;
        }
LAB_00482606:
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x4f) goto LAB_004839e6;
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x41) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x54) goto LAB_00485073;
        pbVar19 = pbVar20 + 5;
        bVar12 = pbVar20[5];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x134;
            goto joined_r0x00484b7f;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x134;
        goto LAB_00485c16;
      }
      if (bVar12 != 0x41) {
        if (bVar12 != 0x49) goto switchD_004813bb_caseD_4a;
        goto LAB_00481fd5;
      }
LAB_00482c82:
      pbVar19 = pbVar20 + 2;
      bVar12 = pbVar20[2];
      if (bVar12 < 0x54) {
        if (bVar12 == 0x4c) {
LAB_004837d2:
          bVar12 = pbVar20[3];
          if ((bVar12 & 0xdf) != 0x53) goto LAB_004846f5;
          bVar12 = pbVar20[4];
          if ((bVar12 & 0xdf) != 0x45) goto LAB_00485073;
          pbVar19 = pbVar20 + 5;
          bVar12 = pbVar20[5];
          if (bVar12 < 0x5b) {
            bVar23 = 0x2f < bVar12;
            bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
          }
          else {
            if (bVar12 < 0x60) {
              iVar16 = 0x151;
              goto joined_r0x004855f0;
            }
            bVar23 = bVar12 != 0x60;
            bVar22 = bVar12 < 0x7b;
          }
          iVar16 = 0x151;
          goto LAB_00485c16;
        }
        if (bVar12 != 0x53) goto switchD_004813bb_caseD_4a;
      }
      else {
        if (bVar12 < 0x6d) {
          if (bVar12 != 0x6c) goto switchD_004813bb_caseD_4a;
          goto LAB_004837d2;
        }
        if (bVar12 != 0x73) goto switchD_004813bb_caseD_4a;
      }
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x54) goto LAB_004846f5;
      pbVar19 = pbVar20 + 4;
      bVar12 = pbVar20[4];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
LAB_00484ddd:
        if ((bool)(bVar23 & bVar22)) goto LAB_00485dd5;
      }
      else {
        if (0x5f < bVar12) {
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
          goto LAB_00484ddd;
        }
        if (bVar12 == 0x5f) goto LAB_00485dd5;
      }
      bVar23 = this->StateOptions == false;
      iVar13 = 0x189;
      goto LAB_00485a2a;
    }
    if (bVar12 < 0x6a) {
      if (bVar12 == 0x61) goto LAB_00482c82;
      if (bVar12 != 0x69) goto switchD_004813bb_caseD_4a;
LAB_00481fd5:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x4e) goto LAB_004839e6;
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x41) goto LAB_004846f5;
      bVar12 = pbVar20[4];
      if ((bVar12 & 0xdf) != 0x4c) goto LAB_00485073;
      pbVar19 = pbVar20 + 5;
      bVar12 = pbVar20[5];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
      }
      else {
        if (bVar12 < 0x60) {
          iVar16 = 0x160;
          goto joined_r0x004855f0;
        }
        bVar23 = bVar12 != 0x60;
        bVar22 = bVar12 < 0x7b;
      }
      iVar16 = 0x160;
    }
    else {
      if (bVar12 < 0x6d) {
        if (bVar12 != 0x6c) goto switchD_004813bb_caseD_4a;
        goto LAB_00482606;
      }
      if (bVar12 != 0x6f) goto switchD_004813bb_caseD_4a;
LAB_00483227:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x52) goto LAB_004839e6;
      pbVar19 = pbVar20 + 3;
      bVar12 = pbVar20[3];
      if (bVar12 < 0x5b) {
        if (bVar12 < 0x41) {
          bVar12 = bVar12 - 0x30;
          iVar16 = 0x12d;
          goto LAB_00483259;
        }
        if (bVar12 != 0x45) goto LAB_00485dd5;
      }
      else {
        if (bVar12 < 0x61) {
          iVar16 = 0x12d;
          goto joined_r0x004855f0;
        }
        if (bVar12 != 0x65) {
          iVar16 = 0x12d;
          goto LAB_00484b63;
        }
      }
      bVar12 = pbVar20[4];
      if ((bVar12 & 0xdf) != 0x41) goto LAB_00485073;
      bVar12 = pbVar20[5];
      if ((bVar12 & 0xdf) != 0x43) goto LAB_0048513d;
      bVar12 = pbVar20[6];
      if ((bVar12 & 0xdf) != 0x48) goto LAB_0048507c;
      pbVar19 = pbVar20 + 7;
      bVar12 = pbVar20[7];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
      }
      else {
        if (bVar12 < 0x60) {
          iVar16 = 0x14f;
          goto joined_r0x004855f0;
        }
        bVar23 = bVar12 != 0x60;
        bVar22 = bVar12 < 0x7b;
      }
      iVar16 = 0x14f;
    }
    goto LAB_00485c16;
  case 0x47:
  case 0x67:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    if (bVar12 < 0x50) {
      if (bVar12 == 0x4c) {
LAB_00481ec4:
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x4f) goto LAB_004839e6;
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x42) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x41) goto LAB_00485073;
        bVar12 = pbVar20[5];
        if ((bVar12 & 0xdf) != 0x4c) goto LAB_0048513d;
        pbVar19 = pbVar20 + 6;
        bVar12 = pbVar20[6];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x175;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x175;
        goto LAB_00485c16;
      }
      if (bVar12 != 0x4f) goto switchD_004813bb_caseD_4a;
    }
    else {
      if (bVar12 < 0x6d) {
        if (bVar12 != 0x6c) goto switchD_004813bb_caseD_4a;
        goto LAB_00481ec4;
      }
      if (bVar12 != 0x6f) goto switchD_004813bb_caseD_4a;
    }
    bVar12 = pbVar20[2];
    if ((bVar12 & 0xdf) != 0x54) goto LAB_004839e6;
    bVar12 = pbVar20[3];
    if ((bVar12 & 0xdf) != 0x4f) goto LAB_004846f5;
    pbVar19 = pbVar20 + 4;
    bVar12 = pbVar20[4];
    if (bVar12 < 0x5b) {
      bVar23 = 0x2f < bVar12;
      bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
LAB_00484741:
      iVar16 = 0x14d;
      goto LAB_00485c16;
    }
    if (0x5f < bVar12) {
      bVar23 = bVar12 != 0x60;
      bVar22 = bVar12 < 0x7b;
      goto LAB_00484741;
    }
    iVar16 = 0x14d;
joined_r0x004855f0:
    if (bVar12 == 0x5f) goto LAB_00485dd5;
    break;
  case 0x48:
  case 0x4a:
  case 0x4b:
  case 0x51:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5f:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x71:
  case 0x78:
  case 0x79:
  case 0x7a:
    goto LAB_00485dd5;
  case 0x49:
  case 0x69:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    if (0x53 < bVar12) {
      if (0x6d < bVar12) {
        if (bVar12 == 0x6e) goto LAB_00482bd7;
        if (bVar12 != 0x73) goto switchD_004813bb_caseD_4a;
LAB_0048233b:
        pbVar19 = pbVar20 + 2;
        bVar12 = pbVar20[2];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x178;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x178;
        goto LAB_00485c16;
      }
      if (bVar12 != 0x66) goto switchD_004813bb_caseD_4a;
LAB_00481b65:
      pbVar19 = pbVar20 + 2;
      bVar12 = pbVar20[2];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
      }
      else {
        if (bVar12 < 0x60) {
          iVar16 = 0x12e;
          goto joined_r0x004855f0;
        }
        bVar23 = bVar12 != 0x60;
        bVar22 = bVar12 < 0x7b;
      }
      iVar16 = 0x12e;
      goto LAB_00485c16;
    }
    if (bVar12 < 0x4e) {
      if (bVar12 != 0x46) goto switchD_004813bb_caseD_4a;
      goto LAB_00481b65;
    }
    if (bVar12 != 0x4e) {
      if (bVar12 != 0x53) goto switchD_004813bb_caseD_4a;
      goto LAB_0048233b;
    }
LAB_00482bd7:
    pbVar19 = pbVar20 + 2;
    bVar12 = pbVar20[2];
    if (bVar12 < 0x5b) {
      if (bVar12 < 0x41) {
        bVar12 = bVar12 - 0x30;
        iVar16 = 0x17e;
        goto LAB_00483259;
      }
      if (bVar12 < 0x53) goto LAB_00485dd5;
      if (bVar12 == 0x53) {
LAB_00483f82:
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x54) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x41) goto LAB_00485073;
        bVar12 = pbVar20[5];
        if ((bVar12 & 0xdf) != 0x4e) goto LAB_0048513d;
        bVar12 = pbVar20[6];
        if ((bVar12 & 0xdf) != 0x43) goto LAB_0048507c;
        bVar12 = pbVar20[7];
        if ((bVar12 & 0xdf) != 0x45) goto LAB_00485085;
        bVar12 = pbVar20[8];
        if ((bVar12 & 0xdf) != 0x4f) goto LAB_004855ae;
        bVar12 = pbVar20[9];
        if ((bVar12 & 0xdf) != 0x46) goto LAB_00485614;
        pbVar19 = pbVar20 + 10;
        bVar12 = pbVar20[10];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x154;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x154;
        goto LAB_00485c16;
      }
      if (0x54 < bVar12) goto LAB_00485dd5;
LAB_0048460e:
      pbVar19 = pbVar20 + 3;
      bVar12 = pbVar20[3];
      if (0x39 < bVar12) {
        if (bVar12 < 0x5f) {
          iVar16 = 0x140;
          goto LAB_00484bc8;
        }
        iVar16 = 0x140;
LAB_00485006:
        if (bVar12 == 0x60 || 0x7a < bVar12) break;
        goto LAB_00485dd5;
      }
      if (0x31 < bVar12) {
        if (bVar12 == 0x38) {
          pbVar19 = pbVar20 + 4;
          bVar12 = pbVar20[4];
          if (bVar12 < 0x5b) {
            bVar23 = 0x2f < bVar12;
            bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
          }
          else {
            if (bVar12 < 0x60) {
              iVar16 = 0x13c;
              goto joined_r0x004855f0;
            }
            bVar23 = bVar12 != 0x60;
            bVar22 = bVar12 < 0x7b;
          }
          iVar16 = 0x13c;
          goto LAB_00485c16;
        }
        goto LAB_00485dd5;
      }
      iVar16 = 0x140;
      if (0x2f < bVar12) {
        if (bVar12 == 0x31) {
          bVar12 = pbVar20[4];
          if (bVar12 != 0x36) goto LAB_00485073;
          pbVar19 = pbVar20 + 5;
          bVar12 = pbVar20[5];
          if (bVar12 < 0x5b) {
            bVar23 = 0x2f < bVar12;
            bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
          }
          else {
            if (bVar12 < 0x60) {
              iVar16 = 0x13e;
              goto joined_r0x004855f0;
            }
            bVar23 = bVar12 != 0x60;
            bVar22 = bVar12 < 0x7b;
          }
          iVar16 = 0x13e;
          goto LAB_00485c16;
        }
        goto LAB_00485dd5;
      }
    }
    else {
      if (bVar12 < 0x73) {
        iVar16 = 0x17e;
        if (bVar12 < 0x61 && bVar12 != 0x5f) break;
        goto LAB_00485dd5;
      }
      if (bVar12 == 0x73) goto LAB_00483f82;
      if (bVar12 < 0x75) goto LAB_0048460e;
      iVar16 = 0x17e;
LAB_00484b63:
      if (bVar12 < 0x7b) goto LAB_00485dd5;
    }
    break;
  case 0x4c:
  case 0x6c:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    if (0x4f < bVar12) {
      if (bVar12 < 0x66) {
        if (bVar12 == 0x61) goto LAB_00482cab;
        if (bVar12 != 0x65) goto switchD_004813bb_caseD_4a;
LAB_0048207a:
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x54) goto LAB_004839e6;
        pbVar19 = pbVar20 + 3;
        bVar12 = pbVar20[3];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 399;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 399;
      }
      else {
        if (bVar12 < 0x6a) {
          if (bVar12 != 0x69) goto switchD_004813bb_caseD_4a;
          goto LAB_004826e5;
        }
        if (bVar12 != 0x6f) goto switchD_004813bb_caseD_4a;
LAB_00483270:
        pbVar19 = pbVar20 + 2;
        bVar12 = pbVar20[2];
        if (bVar12 < 0x4f) {
          if (bVar12 == 0x43) {
LAB_00483b76:
            bVar12 = pbVar20[3];
            if ((bVar12 & 0xdf) != 0x41) goto LAB_004846f5;
            bVar12 = pbVar20[4];
            if ((bVar12 & 0xdf) != 0x4c) goto LAB_00485073;
            bVar12 = pbVar20[5];
            if ((bVar12 & 0xdf) != 0x49) goto LAB_0048513d;
            bVar12 = pbVar20[6];
            if ((bVar12 & 0xdf) != 0x5a) goto LAB_0048507c;
            bVar12 = pbVar20[7];
            if ((bVar12 & 0xdf) != 0x45) goto LAB_00485085;
            bVar12 = pbVar20[8];
            if ((bVar12 & 0xdf) != 0x44) goto LAB_004855ae;
            pbVar19 = pbVar20 + 9;
            bVar12 = pbVar20[9];
            if (bVar12 < 0x5b) {
              bVar23 = 0x2f < bVar12;
              bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
            }
            else {
              if (bVar12 < 0x60) {
                iVar16 = 0x169;
                goto joined_r0x004855f0;
              }
              bVar23 = bVar12 != 0x60;
              bVar22 = bVar12 < 0x7b;
            }
            iVar16 = 0x169;
            goto LAB_00485c16;
          }
          if (bVar12 != 0x4e) goto switchD_004813bb_caseD_4a;
        }
        else {
          if (bVar12 < 100) {
            if (bVar12 != 99) goto switchD_004813bb_caseD_4a;
            goto LAB_00483b76;
          }
          if (bVar12 != 0x6e) goto switchD_004813bb_caseD_4a;
        }
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x47) goto LAB_004846f5;
        pbVar19 = pbVar20 + 4;
        bVar12 = pbVar20[4];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x142;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x142;
      }
      goto LAB_00485c16;
    }
    if (0x45 < bVar12) {
      if (bVar12 != 0x49) {
        if (bVar12 != 0x4f) goto switchD_004813bb_caseD_4a;
        goto LAB_00483270;
      }
LAB_004826e5:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x47) goto LAB_004839e6;
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x48) goto LAB_004846f5;
      bVar12 = pbVar20[4];
      if ((bVar12 & 0xdf) != 0x54) goto LAB_00485073;
      pbVar19 = pbVar20 + 5;
      bVar12 = pbVar20[5];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
LAB_00484f97:
        if ((bool)(bVar23 & bVar22)) goto LAB_00485dd5;
      }
      else {
        if (0x5f < bVar12) {
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
          goto LAB_00484f97;
        }
        if (bVar12 == 0x5f) goto LAB_00485dd5;
      }
      bVar23 = this->StateOptions == false;
      iVar13 = 0x18a;
      goto LAB_00485a2a;
    }
    if (bVar12 != 0x41) {
      if (bVar12 != 0x45) goto switchD_004813bb_caseD_4a;
      goto LAB_0048207a;
    }
LAB_00482cab:
    bVar12 = pbVar20[2];
    if ((bVar12 & 0xdf) != 0x54) goto LAB_004839e6;
    bVar12 = pbVar20[3];
    if ((bVar12 & 0xdf) != 0x45) goto LAB_004846f5;
    bVar12 = pbVar20[4];
    if ((bVar12 & 0xdf) != 0x4e) goto LAB_00485073;
    bVar12 = pbVar20[5];
    if ((bVar12 & 0xdf) != 0x54) goto LAB_0048513d;
    pbVar19 = pbVar20 + 6;
    bVar12 = pbVar20[6];
    if (bVar12 < 0x5b) {
      bVar23 = 0x2f < bVar12;
      bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
    }
    else {
      if (bVar12 < 0x60) {
        iVar16 = 0x16a;
        goto joined_r0x004855f0;
      }
      bVar23 = bVar12 != 0x60;
      bVar22 = bVar12 < 0x7b;
    }
    iVar16 = 0x16a;
    goto LAB_00485c16;
  case 0x4d:
  case 0x6d:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    if (bVar12 < 0x46) {
      if (bVar12 == 0x41) {
LAB_00481c0c:
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x50) goto LAB_004839e6;
        pbVar19 = pbVar20 + 3;
        bVar12 = pbVar20[3];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x17c;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x17c;
        goto LAB_00485c16;
      }
      if (bVar12 != 0x45) goto switchD_004813bb_caseD_4a;
    }
    else {
      if (bVar12 < 0x62) {
        if (bVar12 != 0x61) goto switchD_004813bb_caseD_4a;
        goto LAB_00481c0c;
      }
      if (bVar12 != 0x65) goto switchD_004813bb_caseD_4a;
    }
    bVar12 = pbVar20[2];
    if ((bVar12 & 0xdf) != 0x54) goto LAB_004839e6;
    bVar12 = pbVar20[3];
    if ((bVar12 & 0xdf) != 0x41) goto LAB_004846f5;
    pbVar19 = pbVar20 + 4;
    bVar12 = pbVar20[4];
    if (bVar12 < 0x5b) {
      bVar23 = 0x2f < bVar12;
      bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
    }
    else {
      if (bVar12 < 0x60) {
        iVar16 = 0x185;
        goto joined_r0x004855f0;
      }
      bVar23 = bVar12 != 0x60;
      bVar22 = bVar12 < 0x7b;
    }
    iVar16 = 0x185;
    goto LAB_00485c16;
  case 0x4e:
  case 0x6e:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    if (bVar12 < 0x56) {
      if (bVar12 < 0x46) {
        if (bVar12 != 0x41) {
          if (bVar12 != 0x45) goto switchD_004813bb_caseD_4a;
          goto LAB_00481e12;
        }
LAB_00482c27:
        pbVar19 = pbVar20 + 2;
        bVar12 = pbVar20[2];
        if (bVar12 < 0x55) {
          if (bVar12 == 0x4d) {
LAB_00483791:
            bVar12 = pbVar20[3];
            if ((bVar12 & 0xdf) != 0x45) goto LAB_004846f5;
            pbVar19 = pbVar20 + 4;
            bVar12 = pbVar20[4];
            if (bVar12 < 0x5b) {
              bVar23 = 0x2f < bVar12;
              bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
            }
            else {
              if (bVar12 < 0x60) {
                iVar16 = 0x148;
                goto joined_r0x004855f0;
              }
              bVar23 = bVar12 != 0x60;
              bVar22 = bVar12 < 0x7b;
            }
            iVar16 = 0x148;
            goto LAB_00485c16;
          }
          if (bVar12 != 0x54) goto switchD_004813bb_caseD_4a;
        }
        else {
          if (bVar12 < 0x6e) {
            if (bVar12 != 0x6d) goto switchD_004813bb_caseD_4a;
            goto LAB_00483791;
          }
          if (bVar12 != 0x74) goto switchD_004813bb_caseD_4a;
        }
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x49) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x56) goto LAB_00485073;
        bVar12 = pbVar20[5];
        if ((bVar12 & 0xdf) != 0x45) goto LAB_0048513d;
        pbVar19 = pbVar20 + 6;
        bVar12 = pbVar20[6];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x158;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x158;
      }
      else {
        if (bVar12 == 0x4f) goto LAB_004824aa;
        if (bVar12 != 0x55) goto switchD_004813bb_caseD_4a;
LAB_004831aa:
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x4c) goto LAB_004839e6;
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x4c) goto LAB_004846f5;
        pbVar19 = pbVar20 + 4;
        bVar12 = pbVar20[4];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x174;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x174;
      }
      goto LAB_00485c16;
    }
    if (bVar12 < 0x66) {
      if (bVar12 == 0x61) goto LAB_00482c27;
      if (bVar12 != 0x65) goto switchD_004813bb_caseD_4a;
LAB_00481e12:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x57) goto LAB_004839e6;
      pbVar19 = pbVar20 + 3;
      bVar12 = pbVar20[3];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
      }
      else {
        if (bVar12 < 0x60) {
          iVar16 = 0x153;
          goto joined_r0x004855f0;
        }
        bVar23 = bVar12 != 0x60;
        bVar22 = bVar12 < 0x7b;
      }
      iVar16 = 0x153;
    }
    else {
      if (0x6f < bVar12) {
        if (bVar12 != 0x75) goto switchD_004813bb_caseD_4a;
        goto LAB_004831aa;
      }
      if (bVar12 != 0x6f) goto switchD_004813bb_caseD_4a;
LAB_004824aa:
      pbVar19 = pbVar20 + 2;
      bVar12 = pbVar20[2];
      if (bVar12 < 0x4f) {
        if (bVar12 == 0x44) {
LAB_004839fe:
          bVar12 = pbVar20[3];
          if ((bVar12 & 0xdf) != 0x45) goto LAB_004846f5;
          bVar12 = pbVar20[4];
          if ((bVar12 & 0xdf) != 0x4c) goto LAB_00485073;
          bVar12 = pbVar20[5];
          if ((bVar12 & 0xdf) != 0x41) goto LAB_0048513d;
          bVar12 = pbVar20[6];
          if ((bVar12 & 0xdf) != 0x59) goto LAB_0048507c;
          pbVar19 = pbVar20 + 7;
          bVar12 = pbVar20[7];
          if (bVar12 < 0x5b) {
            bVar23 = 0x2f < bVar12;
            bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
LAB_0048585f:
            if ((bool)(bVar23 & bVar22)) goto LAB_00485dd5;
          }
          else {
            if (0x5f < bVar12) {
              bVar23 = bVar12 != 0x60;
              bVar22 = bVar12 < 0x7b;
              goto LAB_0048585f;
            }
            if (bVar12 == 0x5f) goto LAB_00485dd5;
          }
          bVar23 = this->StateOptions == false;
          iVar13 = 0x18b;
          goto LAB_00485a2a;
        }
        if (bVar12 != 0x4e) goto switchD_004813bb_caseD_4a;
      }
      else {
        if (bVar12 < 0x65) {
          if (bVar12 != 100) goto switchD_004813bb_caseD_4a;
          goto LAB_004839fe;
        }
        if (bVar12 != 0x6e) goto switchD_004813bb_caseD_4a;
      }
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x45) goto LAB_004846f5;
      pbVar19 = pbVar20 + 4;
      bVar12 = pbVar20[4];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
      }
      else {
        if (bVar12 < 0x60) {
          iVar16 = 0x152;
          goto joined_r0x004855f0;
        }
        bVar23 = bVar12 != 0x60;
        bVar22 = bVar12 < 0x7b;
      }
      iVar16 = 0x152;
    }
    goto LAB_00485c16;
  case 0x4f:
  case 0x6f:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    if (bVar12 < 0x57) {
      if (0x4f < bVar12) {
        if (bVar12 != 0x50) {
          if (bVar12 < 0x55) goto switchD_004813bb_caseD_4a;
          if (bVar12 == 0x56) goto LAB_00483024;
          goto LAB_0048354d;
        }
LAB_00482247:
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x54) goto LAB_004839e6;
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x49) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x4f) goto LAB_00485073;
        bVar12 = pbVar20[5];
        if ((bVar12 & 0xdf) != 0x4e) goto LAB_0048513d;
        bVar12 = pbVar20[6];
        if ((bVar12 & 0xdf) != 0x41) goto LAB_0048507c;
        bVar12 = pbVar20[7];
        if ((bVar12 & 0xdf) != 0x4c) goto LAB_00485085;
        pbVar19 = pbVar20 + 8;
        bVar12 = pbVar20[8];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x16f;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x16f;
        goto LAB_00485c16;
      }
      if (bVar12 != 0x46) goto switchD_004813bb_caseD_4a;
LAB_004829c5:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x46) goto LAB_004839e6;
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x53) goto LAB_004846f5;
      bVar12 = pbVar20[4];
      if ((bVar12 & 0xdf) != 0x45) goto LAB_00485073;
      bVar12 = pbVar20[5];
      if ((bVar12 & 0xdf) != 0x54) goto LAB_0048513d;
      pbVar19 = pbVar20 + 6;
      bVar12 = pbVar20[6];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
LAB_004851a8:
        if ((bool)(bVar23 & bVar22)) goto LAB_00485dd5;
      }
      else {
        if (0x5f < bVar12) {
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
          goto LAB_004851a8;
        }
        if (bVar12 == 0x5f) goto LAB_00485dd5;
      }
      bVar23 = this->StateOptions == false;
      iVar13 = 0x18c;
      goto LAB_00485a2a;
    }
    if (bVar12 < 0x71) {
      if (bVar12 != 0x66) {
        if (bVar12 != 0x70) goto switchD_004813bb_caseD_4a;
        goto LAB_00482247;
      }
      goto LAB_004829c5;
    }
    if (bVar12 < 0x75) goto switchD_004813bb_caseD_4a;
    if (bVar12 != 0x75) {
      if (0x76 < bVar12) goto switchD_004813bb_caseD_4a;
LAB_00483024:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x45) goto LAB_004839e6;
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x52) goto LAB_004846f5;
      bVar12 = pbVar20[4];
      if ((bVar12 & 0xdf) != 0x52) goto LAB_00485073;
      bVar12 = pbVar20[5];
      if ((bVar12 & 0xdf) != 0x49) goto LAB_0048513d;
      bVar12 = pbVar20[6];
      if ((bVar12 & 0xdf) != 0x44) goto LAB_0048507c;
      bVar12 = pbVar20[7];
      if ((bVar12 & 0xdf) != 0x45) goto LAB_00485085;
      pbVar19 = pbVar20 + 8;
      bVar12 = pbVar20[8];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
      }
      else {
        if (bVar12 < 0x60) {
          iVar16 = 0x172;
          goto joined_r0x004855f0;
        }
        bVar23 = bVar12 != 0x60;
        bVar22 = bVar12 < 0x7b;
      }
      iVar16 = 0x172;
      goto LAB_00485c16;
    }
LAB_0048354d:
    bVar12 = pbVar20[2];
    if ((bVar12 & 0xdf) != 0x54) goto LAB_004839e6;
    pbVar19 = pbVar20 + 3;
    bVar12 = pbVar20[3];
    if (bVar12 < 0x5b) {
      bVar23 = 0x2f < bVar12;
      bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
    }
    else {
      if (bVar12 < 0x60) {
        iVar16 = 0x15a;
        goto joined_r0x004855f0;
      }
      bVar23 = bVar12 != 0x60;
      bVar22 = bVar12 < 0x7b;
    }
    iVar16 = 0x15a;
    goto LAB_00485c16;
  case 0x50:
  case 0x70:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    if (bVar12 < 0x56) {
      if (bVar12 == 0x52) {
LAB_00482036:
        pbVar19 = pbVar20 + 2;
        bVar12 = pbVar20[2];
        if (bVar12 < 0x50) {
          if (bVar12 == 0x49) {
LAB_00482e4a:
            bVar12 = pbVar20[3];
            if ((bVar12 & 0xdf) != 0x56) goto LAB_004846f5;
            bVar12 = pbVar20[4];
            if ((bVar12 & 0xdf) != 0x41) goto LAB_00485073;
            bVar12 = pbVar20[5];
            if ((bVar12 & 0xdf) != 0x54) goto LAB_0048513d;
            bVar12 = pbVar20[6];
            if ((bVar12 & 0xdf) != 0x45) goto LAB_0048507c;
            pbVar19 = pbVar20 + 7;
            bVar12 = pbVar20[7];
            if (bVar12 < 0x5b) {
              bVar23 = 0x2f < bVar12;
              bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
            }
            else {
              if (bVar12 < 0x60) {
                iVar16 = 0x165;
                goto joined_r0x004855f0;
              }
              bVar23 = bVar12 != 0x60;
              bVar22 = bVar12 < 0x7b;
            }
            iVar16 = 0x165;
            goto LAB_00485c16;
          }
          if (bVar12 != 0x4f) goto switchD_004813bb_caseD_4a;
        }
        else {
          if (bVar12 < 0x6a) {
            if (bVar12 != 0x69) goto switchD_004813bb_caseD_4a;
            goto LAB_00482e4a;
          }
          if (bVar12 != 0x6f) goto switchD_004813bb_caseD_4a;
        }
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x54) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x45) goto LAB_00485073;
        bVar12 = pbVar20[5];
        if ((bVar12 & 0xdf) != 0x43) goto LAB_0048513d;
        bVar12 = pbVar20[6];
        if ((bVar12 & 0xdf) != 0x54) goto LAB_0048507c;
        bVar12 = pbVar20[7];
        if ((bVar12 & 0xdf) != 0x45) goto LAB_00485085;
        bVar12 = pbVar20[8];
        if ((bVar12 & 0xdf) != 0x44) goto LAB_004855ae;
        pbVar19 = pbVar20 + 9;
        bVar12 = pbVar20[9];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x164;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x164;
        goto LAB_00485c16;
      }
      if (bVar12 != 0x55) goto switchD_004813bb_caseD_4a;
    }
    else {
      if (bVar12 < 0x73) {
        if (bVar12 != 0x72) goto switchD_004813bb_caseD_4a;
        goto LAB_00482036;
      }
      if (bVar12 != 0x75) goto switchD_004813bb_caseD_4a;
    }
    bVar12 = pbVar20[2];
    if ((bVar12 & 0xdf) != 0x42) goto LAB_004839e6;
    bVar12 = pbVar20[3];
    if ((bVar12 & 0xdf) != 0x4c) goto LAB_004846f5;
    bVar12 = pbVar20[4];
    if ((bVar12 & 0xdf) != 0x49) goto LAB_00485073;
    bVar12 = pbVar20[5];
    if ((bVar12 & 0xdf) != 0x43) goto LAB_0048513d;
    pbVar19 = pbVar20 + 6;
    bVar12 = pbVar20[6];
    if (bVar12 < 0x5b) {
      bVar23 = 0x2f < bVar12;
      bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
    }
    else {
      if (bVar12 < 0x60) {
        iVar16 = 0x163;
        goto joined_r0x004855f0;
      }
      bVar23 = bVar12 != 0x60;
      bVar22 = bVar12 < 0x7b;
    }
    iVar16 = 0x163;
    goto LAB_00485c16;
  case 0x52:
  case 0x72:
    bVar12 = pbVar20[1];
    if ((bVar12 & 0xdf) != 0x45) {
LAB_00481478:
      pbVar19 = pbVar20 + 1;
      goto switchD_004813bb_caseD_4a;
    }
    pbVar19 = pbVar20 + 2;
    bVar12 = pbVar20[2];
    if (bVar12 < 0x55) {
      if (bVar12 < 0x47) {
        if (bVar12 != 0x41) {
          if (bVar12 != 0x46) goto switchD_004813bb_caseD_4a;
LAB_0048221c:
          pbVar19 = pbVar20 + 3;
          bVar12 = pbVar20[3];
          if (bVar12 < 0x5b) {
            bVar23 = 0x2f < bVar12;
            bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
          }
          else {
            if (bVar12 < 0x60) {
              iVar16 = 0x15b;
              goto joined_r0x004855f0;
            }
            bVar23 = bVar12 != 0x60;
            bVar22 = bVar12 < 0x7b;
          }
          iVar16 = 0x15b;
          goto LAB_00485c16;
        }
LAB_0048367f:
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x44) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x4f) goto LAB_00485073;
        bVar12 = pbVar20[5];
        if ((bVar12 & 0xdf) != 0x4e) goto LAB_0048513d;
        bVar12 = pbVar20[6];
        if ((bVar12 & 0xdf) != 0x4c) goto LAB_0048507c;
        bVar12 = pbVar20[7];
        if ((bVar12 & 0xdf) != 0x59) goto LAB_00485085;
        pbVar19 = pbVar20 + 8;
        bVar12 = pbVar20[8];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x187;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x187;
        goto LAB_00485c16;
      }
      if (bVar12 != 0x50) {
        if (bVar12 != 0x54) goto switchD_004813bb_caseD_4a;
LAB_00483c8e:
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x55) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x52) goto LAB_00485073;
        bVar12 = pbVar20[5];
        if ((bVar12 & 0xdf) != 0x4e) goto LAB_0048513d;
        pbVar19 = pbVar20 + 6;
        bVar12 = pbVar20[6];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x12f;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x12f;
        goto LAB_00485c16;
      }
    }
    else {
      if (bVar12 < 0x67) {
        if (bVar12 != 0x61) {
          if (bVar12 != 0x66) goto switchD_004813bb_caseD_4a;
          goto LAB_0048221c;
        }
        goto LAB_0048367f;
      }
      if (0x70 < bVar12) {
        if (bVar12 != 0x74) goto switchD_004813bb_caseD_4a;
        goto LAB_00483c8e;
      }
      if (bVar12 != 0x70) goto switchD_004813bb_caseD_4a;
    }
    bVar12 = pbVar20[3];
    if ((bVar12 & 0xdf) != 0x4c) goto LAB_004846f5;
    bVar12 = pbVar20[4];
    if ((bVar12 & 0xdf) != 0x41) goto LAB_00485073;
    bVar12 = pbVar20[5];
    if ((bVar12 & 0xdf) != 0x43) goto LAB_0048513d;
    bVar12 = pbVar20[6];
    if ((bVar12 & 0xdf) != 0x45) goto LAB_0048507c;
    bVar12 = pbVar20[7];
    if ((bVar12 & 0xdf) != 0x53) goto LAB_00485085;
    pbVar19 = pbVar20 + 8;
    bVar12 = pbVar20[8];
    if (bVar12 < 0x5b) {
      bVar23 = 0x2f < bVar12;
      bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
    }
    else {
      if (bVar12 < 0x60) {
        iVar16 = 0x179;
        goto joined_r0x004855f0;
      }
      bVar23 = bVar12 != 0x60;
      bVar22 = bVar12 < 0x7b;
    }
    iVar16 = 0x179;
    goto LAB_00485c16;
  case 0x53:
  case 0x73:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    if (0x61 < bVar12) {
      switch(bVar12) {
      case 0x68:
        goto switchD_004813bb_caseD_48;
      case 0x69:
        goto switchD_004813bb_caseD_49;
      case 0x6a:
      case 0x6b:
      case 0x6d:
      case 0x6e:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x73:
      case 0x76:
        goto switchD_004813bb_caseD_4a;
      case 0x6c:
        goto switchD_004813bb_caseD_4c;
      case 0x6f:
        goto switchD_004813bb_caseD_4f;
      case 0x74:
        goto switchD_004813bb_caseD_54;
      case 0x75:
        goto switchD_004813bb_caseD_55;
      case 0x77:
        goto switchD_004813bb_caseD_57;
      default:
        if (bVar12 != 0x62) goto switchD_004813bb_caseD_4a;
        goto LAB_0048383e;
      }
    }
    switch(bVar12) {
    case 0x48:
      goto switchD_004813bb_caseD_48;
    case 0x49:
switchD_004813bb_caseD_49:
      pbVar19 = pbVar20 + 2;
      bVar12 = pbVar20[2];
      if (bVar12 < 0x5b) {
        if (bVar12 != 0x4e) {
          if (bVar12 != 0x5a) goto switchD_004813bb_caseD_4a;
          goto LAB_0048445f;
        }
      }
      else {
        if (0x6e < bVar12) {
          if (bVar12 != 0x7a) goto switchD_004813bb_caseD_4a;
LAB_0048445f:
          bVar12 = pbVar20[3];
          if ((bVar12 & 0xdf) != 0x45) goto LAB_004846f5;
          bVar12 = pbVar20[4];
          if ((bVar12 & 0xdf) != 0x4f) goto LAB_00485073;
          bVar12 = pbVar20[5];
          if ((bVar12 & 0xdf) != 0x46) goto LAB_0048513d;
          pbVar19 = pbVar20 + 6;
          bVar12 = pbVar20[6];
          if (bVar12 < 0x5b) {
            bVar23 = 0x2f < bVar12;
            bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
          }
          else {
            if (bVar12 < 0x60) {
              iVar16 = 0x17f;
              goto joined_r0x004855f0;
            }
            bVar23 = bVar12 != 0x60;
            bVar22 = bVar12 < 0x7b;
          }
          iVar16 = 0x17f;
          break;
        }
        if (bVar12 != 0x6e) goto switchD_004813bb_caseD_4a;
      }
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x47) goto LAB_004846f5;
      bVar12 = pbVar20[4];
      if ((bVar12 & 0xdf) != 0x55) goto LAB_00485073;
      bVar12 = pbVar20[5];
      if ((bVar12 & 0xdf) != 0x4c) goto LAB_0048513d;
      bVar12 = pbVar20[6];
      if ((bVar12 & 0xdf) != 0x41) goto LAB_0048507c;
      bVar12 = pbVar20[7];
      if ((bVar12 & 0xdf) != 0x52) goto LAB_00485085;
      pbVar19 = pbVar20 + 8;
      bVar12 = pbVar20[8];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
      }
      else {
        if (bVar12 < 0x60) {
          iVar16 = 0x16b;
          goto joined_r0x004855f0;
        }
        bVar23 = bVar12 != 0x60;
        bVar22 = bVar12 < 0x7b;
      }
      iVar16 = 0x16b;
      break;
    case 0x4a:
    case 0x4b:
    case 0x4d:
    case 0x4e:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x56:
      goto switchD_004813bb_caseD_4a;
    case 0x4c:
switchD_004813bb_caseD_4c:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x4f) goto LAB_004839e6;
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x57) goto LAB_004846f5;
      pbVar19 = pbVar20 + 4;
      bVar12 = pbVar20[4];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
LAB_00484c65:
        if ((bool)(bVar23 & bVar22)) goto LAB_00485dd5;
      }
      else {
        if (0x5f < bVar12) {
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
          goto LAB_00484c65;
        }
        if (bVar12 == 0x5f) goto LAB_00485dd5;
      }
      bVar23 = this->StateOptions == false;
      iVar13 = 0x18d;
      goto LAB_00485a2a;
    case 0x4f:
switchD_004813bb_caseD_4f:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x55) goto LAB_004839e6;
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x4e) goto LAB_004846f5;
      bVar12 = pbVar20[4];
      if ((bVar12 & 0xdf) != 0x44) goto LAB_00485073;
      pbVar19 = pbVar20 + 5;
      bVar12 = pbVar20[5];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
      }
      else {
        if (bVar12 < 0x60) {
          iVar16 = 0x14a;
          goto joined_r0x004855f0;
        }
        bVar23 = bVar12 != 0x60;
        bVar22 = bVar12 < 0x7b;
      }
      iVar16 = 0x14a;
      break;
    case 0x54:
switchD_004813bb_caseD_54:
      pbVar19 = pbVar20 + 2;
      bVar12 = pbVar20[2];
      if (bVar12 < 0x53) {
        if (bVar12 < 0x4f) {
          if (bVar12 != 0x41) goto switchD_004813bb_caseD_4a;
LAB_00483d8a:
          bVar12 = pbVar20[3];
          if ((bVar12 & 0xdf) != 0x54) goto LAB_004846f5;
          pbVar19 = pbVar20 + 4;
          bVar12 = pbVar20[4];
          if (bVar12 < 0x4a) {
            if (bVar12 == 0x45) {
LAB_00484c90:
              pbVar19 = pbVar20 + 5;
              bVar12 = pbVar20[5];
              if (bVar12 < 0x5b) {
                if (bVar12 < 0x41) {
                  bVar12 = bVar12 - 0x30;
                  iVar16 = 0x14b;
                  goto LAB_00483259;
                }
                if (bVar12 != 0x53) goto LAB_00485dd5;
              }
              else {
                if (bVar12 < 0x61) {
                  iVar16 = 0x14b;
                  goto joined_r0x004855f0;
                }
                if (bVar12 != 0x73) {
                  iVar16 = 0x14b;
                  goto LAB_00484b63;
                }
              }
              pbVar19 = pbVar20 + 6;
              bVar12 = pbVar20[6];
              if (bVar12 < 0x5b) {
                bVar23 = 0x2f < bVar12;
                bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
              }
              else {
                if (bVar12 < 0x60) {
                  iVar16 = 0x181;
                  goto joined_r0x0048582a;
                }
                bVar23 = bVar12 != 0x60;
                bVar22 = bVar12 < 0x7b;
              }
              iVar16 = 0x181;
              break;
            }
            if (bVar12 != 0x49) goto switchD_004813bb_caseD_4a;
          }
          else {
            if (bVar12 < 0x66) {
              if (bVar12 != 0x65) goto switchD_004813bb_caseD_4a;
              goto LAB_00484c90;
            }
            if (bVar12 != 0x69) goto switchD_004813bb_caseD_4a;
          }
          bVar12 = pbVar20[5];
          if ((bVar12 & 0xdf) != 0x43) goto LAB_0048513d;
          pbVar19 = pbVar20 + 6;
          bVar12 = pbVar20[6];
          if (bVar12 < 0x5b) {
            bVar23 = 0x2f < bVar12;
            bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
          }
          else {
            if (bVar12 < 0x60) {
              iVar16 = 0x15d;
              goto joined_r0x004855f0;
            }
            bVar23 = bVar12 != 0x60;
            bVar22 = bVar12 < 0x7b;
          }
          iVar16 = 0x15d;
        }
        else {
          if (bVar12 != 0x4f) {
            if (bVar12 != 0x52) goto switchD_004813bb_caseD_4a;
            goto LAB_004844d6;
          }
LAB_004846c7:
          bVar12 = pbVar20[3];
          if ((bVar12 & 0xdf) != 0x50) goto LAB_004846f5;
          pbVar19 = pbVar20 + 4;
          bVar12 = pbVar20[4];
          if (bVar12 < 0x5b) {
            bVar23 = 0x2f < bVar12;
            bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
          }
          else {
            if (bVar12 < 0x60) {
              iVar16 = 0x176;
              goto joined_r0x004855f0;
            }
            bVar23 = bVar12 != 0x60;
            bVar22 = bVar12 < 0x7b;
          }
          iVar16 = 0x176;
        }
      }
      else {
        if (bVar12 < 0x6f) {
          if (bVar12 != 0x61) goto switchD_004813bb_caseD_4a;
          goto LAB_00483d8a;
        }
        if (bVar12 == 0x6f) goto LAB_004846c7;
        if (bVar12 != 0x72) goto switchD_004813bb_caseD_4a;
LAB_004844d6:
        pbVar19 = pbVar20 + 3;
        bVar12 = pbVar20[3];
        if (bVar12 < 0x56) {
          if (bVar12 == 0x49) {
LAB_00484ad3:
            bVar12 = pbVar20[4];
            if ((bVar12 & 0xdf) != 0x4e) goto LAB_00485073;
            bVar12 = pbVar20[5];
            if ((bVar12 & 0xdf) != 0x47) goto LAB_0048513d;
            pbVar19 = pbVar20 + 6;
            bVar12 = pbVar20[6];
            if (bVar12 < 0x5b) {
              bVar23 = 0x2f < bVar12;
              bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
            }
            else {
              if (bVar12 < 0x60) {
                iVar16 = 0x149;
                goto joined_r0x004855f0;
              }
              bVar23 = bVar12 != 0x60;
              bVar22 = bVar12 < 0x7b;
            }
            iVar16 = 0x149;
            break;
          }
          if (bVar12 != 0x55) goto switchD_004813bb_caseD_4a;
        }
        else {
          if (bVar12 < 0x6a) {
            if (bVar12 != 0x69) goto switchD_004813bb_caseD_4a;
            goto LAB_00484ad3;
          }
          if (bVar12 != 0x75) goto switchD_004813bb_caseD_4a;
        }
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x43) goto LAB_00485073;
        bVar12 = pbVar20[5];
        if ((bVar12 & 0xdf) != 0x54) goto LAB_0048513d;
        pbVar19 = pbVar20 + 6;
        bVar12 = pbVar20[6];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x145;
joined_r0x0048582a:
            pbVar19 = pbVar20 + 6;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x145;
      }
      break;
    case 0x55:
switchD_004813bb_caseD_55:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x50) goto LAB_004839e6;
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x45) goto LAB_004846f5;
      bVar12 = pbVar20[4];
      if ((bVar12 & 0xdf) != 0x52) goto LAB_00485073;
      pbVar19 = pbVar20 + 5;
      bVar12 = pbVar20[5];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
      }
      else {
        if (bVar12 < 0x60) {
          iVar16 = 0x173;
          goto joined_r0x004855f0;
        }
        bVar23 = bVar12 != 0x60;
        bVar22 = bVar12 < 0x7b;
      }
      iVar16 = 0x173;
      break;
    case 0x57:
switchD_004813bb_caseD_57:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x49) goto LAB_004839e6;
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x54) goto LAB_004846f5;
      bVar12 = pbVar20[4];
      if ((bVar12 & 0xdf) != 0x43) goto LAB_00485073;
      bVar12 = pbVar20[5];
      if ((bVar12 & 0xdf) != 0x48) goto LAB_0048513d;
      pbVar19 = pbVar20 + 6;
      bVar12 = pbVar20[6];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
      }
      else {
        if (bVar12 < 0x60) {
          iVar16 = 0x130;
          goto joined_r0x004855f0;
        }
        bVar23 = bVar12 != 0x60;
        bVar22 = bVar12 < 0x7b;
      }
      iVar16 = 0x130;
      break;
    default:
      if (bVar12 != 0x42) goto switchD_004813bb_caseD_4a;
LAB_0048383e:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x59) goto LAB_004839e6;
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x54) goto LAB_004846f5;
      bVar12 = pbVar20[4];
      if ((bVar12 & 0xdf) != 0x45) goto LAB_00485073;
      pbVar19 = pbVar20 + 5;
      bVar12 = pbVar20[5];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
      }
      else {
        if (bVar12 < 0x60) {
          iVar16 = 0x139;
          goto joined_r0x004855f0;
        }
        bVar23 = bVar12 != 0x60;
        bVar22 = bVar12 < 0x7b;
      }
      iVar16 = 0x139;
    }
    goto LAB_00485c16;
  case 0x54:
  case 0x74:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    if (bVar12 < 0x53) {
      if (bVar12 == 0x48) {
LAB_00481e53:
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x52) goto LAB_004839e6;
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x4f) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x57) goto LAB_00485073;
        bVar12 = pbVar20[5];
        if ((bVar12 & 0xdf) != 0x53) goto LAB_0048513d;
        pbVar19 = pbVar20 + 6;
        bVar12 = pbVar20[6];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x161;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x161;
        goto LAB_00485c16;
      }
      if (bVar12 != 0x52) goto switchD_004813bb_caseD_4a;
    }
    else {
      if (bVar12 < 0x69) {
        if (bVar12 != 0x68) goto switchD_004813bb_caseD_4a;
        goto LAB_00481e53;
      }
      if (bVar12 != 0x72) goto switchD_004813bb_caseD_4a;
    }
    pbVar19 = pbVar20 + 2;
    bVar12 = pbVar20[2];
    if (bVar12 < 0x56) {
      if (bVar12 != 0x41) {
        if (bVar12 != 0x55) goto switchD_004813bb_caseD_4a;
LAB_00483a69:
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x45) goto LAB_004846f5;
        pbVar19 = pbVar20 + 4;
        bVar12 = pbVar20[4];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x150;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x150;
        goto LAB_00485c16;
      }
    }
    else {
      if (0x61 < bVar12) {
        if (bVar12 != 0x75) goto switchD_004813bb_caseD_4a;
        goto LAB_00483a69;
      }
      if (bVar12 != 0x61) goto switchD_004813bb_caseD_4a;
    }
    bVar12 = pbVar20[3];
    if ((bVar12 & 0xdf) != 0x4e) goto LAB_004846f5;
    bVar12 = pbVar20[4];
    if ((bVar12 & 0xdf) != 0x53) goto LAB_00485073;
    bVar12 = pbVar20[5];
    if ((bVar12 & 0xdf) != 0x49) goto LAB_0048513d;
    bVar12 = pbVar20[6];
    if ((bVar12 & 0xdf) != 0x45) {
LAB_0048507c:
      pbVar19 = pbVar20 + 6;
      goto switchD_004813bb_caseD_4a;
    }
    bVar12 = pbVar20[7];
    if ((bVar12 & 0xdf) != 0x4e) {
LAB_00485085:
      pbVar19 = pbVar20 + 7;
      goto switchD_004813bb_caseD_4a;
    }
    bVar12 = pbVar20[8];
    if ((bVar12 & 0xdf) != 0x54) {
LAB_004855ae:
      pbVar19 = pbVar20 + 8;
      goto switchD_004813bb_caseD_4a;
    }
    pbVar19 = pbVar20 + 9;
    bVar12 = pbVar20[9];
    if (bVar12 < 0x5b) {
      bVar23 = 0x2f < bVar12;
      bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
    }
    else {
      if (bVar12 < 0x60) {
        iVar16 = 0x15e;
        goto joined_r0x004855f0;
      }
      bVar23 = bVar12 != 0x60;
      bVar22 = bVar12 < 0x7b;
    }
    iVar16 = 0x15e;
    goto LAB_00485c16;
  case 0x55:
  case 0x75:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    if (0x68 < bVar12) {
      if (bVar12 < 0x6e) {
        if (bVar12 == 0x69) goto LAB_00482879;
        if (bVar12 != 0x6c) goto switchD_004813bb_caseD_4a;
LAB_004820c7:
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x4f) goto LAB_004839e6;
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x4e) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x47) goto LAB_00485073;
        pbVar19 = pbVar20 + 5;
        bVar12 = pbVar20[5];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x143;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x143;
      }
      else {
        if (bVar12 != 0x6e) {
          if (bVar12 != 0x73) goto switchD_004813bb_caseD_4a;
          goto LAB_0048275c;
        }
LAB_004828f9:
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x54) goto LAB_004839e6;
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x49) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x4c) goto LAB_00485073;
        pbVar19 = pbVar20 + 5;
        bVar12 = pbVar20[5];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x131;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x131;
      }
      goto LAB_00485c16;
    }
    if (bVar12 < 0x4e) {
      if (bVar12 != 0x49) {
        if (bVar12 != 0x4c) goto switchD_004813bb_caseD_4a;
        goto LAB_004820c7;
      }
LAB_00482879:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x4e) goto LAB_004839e6;
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x54) goto LAB_004846f5;
      pbVar19 = pbVar20 + 4;
      bVar12 = pbVar20[4];
      if (bVar12 < 0x3a) {
        if (bVar12 < 0x32) {
          iVar16 = 0x141;
          if (bVar12 < 0x30) break;
          if (bVar12 == 0x31) {
            bVar12 = pbVar20[5];
            if (bVar12 != 0x36) goto LAB_0048513d;
            pbVar19 = pbVar20 + 6;
            bVar12 = pbVar20[6];
            if (bVar12 < 0x5b) {
              bVar23 = 0x2f < bVar12;
              bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
            }
            else {
              if (bVar12 < 0x60) {
                iVar16 = 0x13f;
                goto joined_r0x004855f0;
              }
              bVar23 = bVar12 != 0x60;
              bVar22 = bVar12 < 0x7b;
            }
            iVar16 = 0x13f;
            goto LAB_00485c16;
          }
        }
        else if (bVar12 == 0x38) {
          pbVar19 = pbVar20 + 5;
          bVar12 = pbVar20[5];
          if (bVar12 < 0x5b) {
            bVar23 = 0x2f < bVar12;
            bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
          }
          else {
            if (bVar12 < 0x60) {
              iVar16 = 0x13d;
              goto joined_r0x004855f0;
            }
            bVar23 = bVar12 != 0x60;
            bVar22 = bVar12 < 0x7b;
          }
          iVar16 = 0x13d;
          goto LAB_00485c16;
        }
      }
      else {
        if (0x5e < bVar12) {
          iVar16 = 0x141;
          goto LAB_00485006;
        }
        iVar16 = 0x141;
LAB_00484bc8:
        if (0x19 < (byte)(bVar12 + 0xbf)) break;
      }
      goto LAB_00485dd5;
    }
    if (bVar12 == 0x4e) goto LAB_004828f9;
    if (bVar12 != 0x53) goto switchD_004813bb_caseD_4a;
LAB_0048275c:
    bVar12 = pbVar20[2];
    if ((bVar12 & 0xdf) != 0x48) goto LAB_004839e6;
    bVar12 = pbVar20[3];
    if ((bVar12 & 0xdf) != 0x4f) goto LAB_004846f5;
    bVar12 = pbVar20[4];
    if ((bVar12 & 0xdf) != 0x52) goto LAB_00485073;
    bVar12 = pbVar20[5];
    if ((bVar12 & 0xdf) != 0x54) goto LAB_0048513d;
    pbVar19 = pbVar20 + 6;
    bVar12 = pbVar20[6];
    if (bVar12 < 0x5b) {
      bVar23 = 0x2f < bVar12;
      bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
    }
    else {
      if (bVar12 < 0x60) {
        iVar16 = 0x13b;
        goto joined_r0x004855f0;
      }
      bVar23 = bVar12 != 0x60;
      bVar22 = bVar12 < 0x7b;
    }
    iVar16 = 0x13b;
    goto LAB_00485c16;
  case 0x56:
  case 0x76:
    pbVar19 = pbVar20 + 1;
    bVar12 = pbVar20[1];
    if (bVar12 < 0x50) {
      if (bVar12 < 0x46) {
        if (bVar12 != 0x41) {
          if (bVar12 != 0x45) goto switchD_004813bb_caseD_4a;
          goto LAB_00481f41;
        }
LAB_00482c50:
        bVar12 = pbVar20[2];
        if ((bVar12 & 0xdf) != 0x52) goto LAB_004839e6;
        pbVar19 = pbVar20 + 3;
        bVar12 = pbVar20[3];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x159;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x159;
      }
      else {
        if (bVar12 == 0x49) goto LAB_00482572;
        if (bVar12 != 0x4f) goto switchD_004813bb_caseD_4a;
LAB_004831f5:
        pbVar19 = pbVar20 + 2;
        bVar12 = pbVar20[2];
        if (bVar12 < 0x4d) {
          if (bVar12 == 0x49) {
LAB_00483aaa:
            bVar12 = pbVar20[3];
            if ((bVar12 & 0xdf) != 0x44) goto LAB_004846f5;
            pbVar19 = pbVar20 + 4;
            bVar12 = pbVar20[4];
            if (bVar12 < 0x5b) {
              bVar23 = 0x2f < bVar12;
              bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
            }
            else {
              if (bVar12 < 0x60) {
                iVar16 = 0x144;
                goto joined_r0x004855f0;
              }
              bVar23 = bVar12 != 0x60;
              bVar22 = bVar12 < 0x7b;
            }
            iVar16 = 0x144;
            goto LAB_00485c16;
          }
          if (bVar12 != 0x4c) goto switchD_004813bb_caseD_4a;
        }
        else {
          if (bVar12 < 0x6a) {
            if (bVar12 != 0x69) goto switchD_004813bb_caseD_4a;
            goto LAB_00483aaa;
          }
          if (bVar12 != 0x6c) goto switchD_004813bb_caseD_4a;
        }
        bVar12 = pbVar20[3];
        if ((bVar12 & 0xdf) != 0x41) goto LAB_004846f5;
        bVar12 = pbVar20[4];
        if ((bVar12 & 0xdf) != 0x54) goto LAB_00485073;
        bVar12 = pbVar20[5];
        if ((bVar12 & 0xdf) != 0x49) goto LAB_0048513d;
        bVar12 = pbVar20[6];
        if ((bVar12 & 0xdf) != 0x4c) goto LAB_0048507c;
        bVar12 = pbVar20[7];
        if ((bVar12 & 0xdf) != 0x45) goto LAB_00485085;
        pbVar19 = pbVar20 + 8;
        bVar12 = pbVar20[8];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x15f;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x15f;
      }
    }
    else if (bVar12 < 0x66) {
      if (bVar12 == 0x61) goto LAB_00482c50;
      if (bVar12 != 0x65) goto switchD_004813bb_caseD_4a;
LAB_00481f41:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x43) goto LAB_004839e6;
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x54) goto LAB_004846f5;
      bVar12 = pbVar20[4];
      if ((bVar12 & 0xdf) != 0x4f) goto LAB_00485073;
      bVar12 = pbVar20[5];
      if ((bVar12 & 0xdf) != 0x52) goto LAB_0048513d;
      pbVar19 = pbVar20 + 6;
      bVar12 = pbVar20[6];
      if (bVar12 < 0x32) goto switchD_004813bb_caseD_4a;
      if (bVar12 != 0x32) {
        if (0x33 < bVar12) goto switchD_004813bb_caseD_4a;
        pbVar19 = pbVar20 + 7;
        bVar12 = pbVar20[7];
        if (bVar12 < 0x5b) {
          bVar23 = 0x2f < bVar12;
          bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
        }
        else {
          if (bVar12 < 0x60) {
            iVar16 = 0x17b;
            goto joined_r0x004855f0;
          }
          bVar23 = bVar12 != 0x60;
          bVar22 = bVar12 < 0x7b;
        }
        iVar16 = 0x17b;
        goto LAB_00485c16;
      }
      pbVar19 = pbVar20 + 7;
      bVar12 = pbVar20[7];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
      }
      else {
        if (bVar12 < 0x60) {
          iVar16 = 0x17a;
          goto joined_r0x004855f0;
        }
        bVar23 = bVar12 != 0x60;
        bVar22 = bVar12 < 0x7b;
      }
      iVar16 = 0x17a;
    }
    else {
      if (0x69 < bVar12) {
        if (bVar12 != 0x6f) goto switchD_004813bb_caseD_4a;
        goto LAB_004831f5;
      }
      if (bVar12 != 0x69) goto switchD_004813bb_caseD_4a;
LAB_00482572:
      bVar12 = pbVar20[2];
      if ((bVar12 & 0xdf) != 0x52) goto LAB_004839e6;
      bVar12 = pbVar20[3];
      if ((bVar12 & 0xdf) != 0x54) goto LAB_004846f5;
      bVar12 = pbVar20[4];
      if ((bVar12 & 0xdf) != 0x55) goto LAB_00485073;
      bVar12 = pbVar20[5];
      if ((bVar12 & 0xdf) != 0x41) goto LAB_0048513d;
      bVar12 = pbVar20[6];
      if ((bVar12 & 0xdf) != 0x4c) goto LAB_0048507c;
      pbVar19 = pbVar20 + 7;
      bVar12 = pbVar20[7];
      if (bVar12 < 0x5b) {
        bVar23 = 0x2f < bVar12;
        bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
      }
      else {
        if (bVar12 < 0x60) {
          iVar16 = 0x171;
          goto joined_r0x004855f0;
        }
        bVar23 = bVar12 != 0x60;
        bVar22 = bVar12 < 0x7b;
      }
      iVar16 = 0x171;
    }
    goto LAB_00485c16;
  case 0x57:
  case 0x77:
    bVar12 = pbVar20[1];
    if ((bVar12 & 0xdf) != 0x48) goto LAB_00481478;
    bVar12 = pbVar20[2];
    if ((bVar12 & 0xdf) != 0x49) goto LAB_004839e6;
    bVar12 = pbVar20[3];
    if ((bVar12 & 0xdf) != 0x4c) goto LAB_004846f5;
    bVar12 = pbVar20[4];
    if ((bVar12 & 0xdf) != 0x45) goto LAB_00485073;
    pbVar19 = pbVar20 + 5;
    bVar12 = pbVar20[5];
    if (bVar12 < 0x5b) {
      bVar23 = 0x2f < bVar12;
      bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
    }
    else {
      if (bVar12 < 0x60) {
        iVar16 = 0x132;
        goto joined_r0x004855f0;
      }
      bVar23 = bVar12 != 0x60;
      bVar22 = bVar12 < 0x7b;
    }
    iVar16 = 0x132;
LAB_00485c16:
    if ((bool)(bVar23 & bVar22)) goto LAB_00485dd5;
    break;
  case 0x5b:
    pbVar19 = pbVar20 + 1;
    iVar16 = 0x5b;
    break;
  case 0x5d:
    pbVar19 = pbVar20 + 1;
    iVar16 = 0x5d;
    break;
  case 0x5e:
    bVar23 = pbVar20[1] == 0x3d;
    iVar13 = 0x114;
    iVar16 = 0x5e;
LAB_00481a7a:
    pbVar19 = pbVar20 + 1;
    if (bVar23) {
      iVar16 = iVar13;
    }
    pbVar18 = pbVar20 + 2;
LAB_00481a81:
    if (bVar23) {
      pbVar19 = pbVar18;
    }
    break;
  case 0x7b:
    this->StateOptions = false;
    pbVar19 = pbVar20 + 1;
    iVar16 = 0x7b;
    break;
  case 0x7c:
    if (pbVar20[1] == 0x3d) {
      pbVar19 = pbVar20 + 2;
      iVar16 = 0x115;
    }
    else if (pbVar20[1] == 0x7c) {
      pbVar19 = pbVar20 + 2;
      iVar16 = 0x11c;
    }
    else {
      pbVar19 = pbVar20 + 1;
      iVar16 = 0x7c;
    }
    break;
  case 0x7d:
LAB_00481810:
    pbVar19 = pbVar20 + 1;
    iVar16 = 0x7d;
    break;
  case 0x7e:
    pbVar19 = pbVar20 + 1;
    iVar16 = 0x7e;
    if (pbVar20[1] == 0x3d) {
      bVar23 = pbVar20[2] == 0x3d;
      iVar13 = 0x121;
      iVar16 = 0x7e;
      goto LAB_00481ae7;
    }
  }
LAB_00481a87:
  this->TokenType = iVar16;
  if (pbVar2 <= pbVar19) {
    pbVar19 = (byte *)this->ScriptEndPtr;
  }
  this->ScriptPtr = (char *)pbVar19;
  uVar9 = (int)pbVar19 - iVar8;
  this->StringLen = uVar9;
  goto LAB_00485e29;
  while (*pbVar19 < 0x21) {
LAB_00480a20:
    pbVar19 = pbVar20 + 1;
    pbVar20 = pbVar20 + 1;
    if (*pbVar19 == 10) break;
  }
  if (0x25 < bVar12) {
LAB_004809af:
    iVar8 = this->Line;
    do {
      while( true ) {
        pbVar19 = pbVar20;
        pbVar20 = pbVar19 + 1;
        if (*pbVar19 == 0x2a) break;
        if (*pbVar19 == 10) {
          if (pbVar2 <= pbVar20) goto LAB_00480c4c;
          iVar8 = iVar8 + 1;
          this->Line = iVar8;
          this->Crossed = true;
        }
      }
    } while (*pbVar20 != 0x2f);
    pbVar20 = pbVar19 + 2;
    if (pbVar2 <= pbVar20) goto LAB_00480c4c;
  }
  goto LAB_004803a3;
LAB_00480495:
  lVar14 = lVar14 + 1;
  pbVar18 = pbVar18 + 1;
  pbVar17 = pbVar17 + 1;
  goto LAB_0048041f;
LAB_004811e4:
  pbVar18 = pbVar19;
  bVar12 = pbVar18[-1];
  if (0x45 < bVar12) {
    pbVar19 = pbVar18 + -1;
    if (bVar12 < 0x61) {
      if (bVar12 == 0x5f || bVar12 < 0x5b) goto LAB_00485fb4;
      goto LAB_00485e09;
    }
    if (0x65 < bVar12) goto joined_r0x00483bfe;
    if (bVar12 != 0x65) goto LAB_00485fb4;
LAB_00482ebe:
    bVar12 = *pbVar18;
    pbVar19 = pbVar18;
    if (bVar12 < 0x2d) {
      if (bVar12 != 0x2b) goto joined_r0x00485445;
      goto LAB_00483e55;
    }
    if (bVar12 == 0x2d) goto LAB_00483e55;
    if (9 < (byte)(bVar12 - 0x30)) goto LAB_00485fba;
    pbVar19 = pbVar18 + 2;
    goto LAB_0048456f;
  }
  if (0x2e < bVar12) {
    if (0x39 < bVar12) {
      pbVar19 = pbVar18 + -1;
      if (bVar12 < 0x41) goto LAB_00485e09;
      if (bVar12 == 0x45) goto LAB_00482ebe;
      goto LAB_00485fb4;
    }
    pbVar19 = pbVar18 + 1;
    if (bVar12 == 0x2f) goto code_r0x0048120f;
    goto LAB_004811e4;
  }
  pbVar19 = pbVar18 + -1;
  if (bVar12 == 0x27) goto LAB_00485fb4;
  if (bVar12 != 0x2e) goto LAB_00485e09;
LAB_0048116c:
  pbVar19 = pbVar19 + 2;
  do {
    pbVar18 = pbVar19;
    bVar12 = pbVar18[-1];
    if (0x45 < bVar12) {
      pbVar19 = pbVar18 + -1;
      if (bVar12 < 0x65) goto joined_r0x004827da;
      if (bVar12 == 0x65) goto LAB_0048343d;
      if (0x66 < bVar12) goto LAB_00485e09;
      goto LAB_00483f28;
    }
    if (bVar12 < 0x30) goto LAB_0048119b;
    pbVar19 = pbVar18 + 1;
  } while (bVar12 < 0x3a);
  if (bVar12 == 0x45) {
LAB_0048343d:
    bVar12 = *pbVar18;
    pbVar19 = pbVar18 + -1;
    if (bVar12 < 0x2d) {
      if (bVar12 == 0x2b) {
LAB_00483e55:
        if ((byte)(pbVar18[1] - 0x30) < 10) {
          pbVar18 = pbVar18 + 1;
LAB_00483e64:
          pbVar19 = pbVar18 + 1;
          bVar12 = *pbVar19;
          if (bVar12 < 0x46) goto code_r0x00483e72;
          bVar12 = bVar12 & 0xdf;
joined_r0x004827da:
          if (bVar12 == 0x46) {
LAB_00483f28:
            pbVar19 = pbVar19 + 1;
          }
        }
      }
    }
    else {
      if (bVar12 == 0x2d) goto LAB_00483e55;
      if ((byte)(bVar12 - 0x30) < 10) goto LAB_00483e64;
    }
  }
  else {
LAB_0048119b:
    pbVar19 = pbVar18 + -1;
  }
  goto LAB_00485e09;
LAB_0048456f:
  pbVar18 = pbVar19;
  bVar12 = pbVar18[-1];
  if (bVar12 < 0x5b) {
    if (0x39 < bVar12) {
      pbVar19 = pbVar18 + -1;
      if (bVar12 < 0x41) goto LAB_00485e09;
      if (bVar12 == 0x46) goto LAB_0048542b;
      goto LAB_00485fb4;
    }
    if (bVar12 == 0x27) {
      pbVar19 = pbVar18 + -1;
      goto LAB_00485fb4;
    }
    pbVar19 = pbVar18 + 1;
    if (bVar12 < 0x30) goto LAB_0048119b;
    goto LAB_0048456f;
  }
  pbVar19 = pbVar18 + -1;
  if (bVar12 < 0x66) {
    if (bVar12 == 0x5f || 0x60 < bVar12) goto LAB_00485fb4;
    goto LAB_00485e09;
  }
  if (bVar12 != 0x66) goto joined_r0x00483bfe;
LAB_0048542b:
  bVar12 = *pbVar18;
  pbVar19 = pbVar18;
  if (bVar12 < 0x5b) {
    if (bVar12 < 0x30) goto joined_r0x00485445;
    if (6 < (byte)(bVar12 - 0x3a)) goto LAB_00485fb4;
    goto LAB_00485e09;
  }
  if (bVar12 < 0x61) goto joined_r0x004857c3;
joined_r0x00483bfe:
  if (3 < (byte)(bVar12 + 0x85)) {
LAB_00485fb4:
    do {
      bVar12 = pbVar19[1];
      pbVar19 = pbVar19 + 1;
LAB_00485fba:
      if (bVar12 < 0x5b) {
        pbVar18 = pbVar19;
        if (bVar12 < 0x30) {
joined_r0x00485445:
          pbVar19 = pbVar18;
          if (bVar12 != 0x27) break;
        }
        else if (0xf8 < (byte)(bVar12 + 0xbf)) break;
        goto LAB_00485fb4;
      }
      if (bVar12 < 0x61) {
joined_r0x004857c3:
        if (bVar12 != 0x5f) break;
        goto LAB_00485fb4;
      }
    } while ((byte)(bVar12 + 0x81) < 0xfc);
  }
  goto LAB_00485e09;
code_r0x0048120f:
  pbVar19 = pbVar18 + -1;
  goto LAB_00485e09;
code_r0x00483e72:
  pbVar18 = pbVar19;
  if (9 < (byte)(bVar12 - 0x30)) goto LAB_00485e09;
  goto LAB_00483e64;
LAB_00485f15:
  pbVar18 = pbVar19;
  if (bVar12 < 0x3b) {
    if (bVar12 < 0x23) {
joined_r0x00485f58:
      if (bVar12 != 0x21) goto LAB_00485e09;
    }
    else if (bVar12 == 0x2f) {
      pbVar18 = pbVar19 + 1;
      bVar12 = pbVar19[1];
      if (bVar12 < 0x30) {
        if (bVar12 < 0x23) goto joined_r0x00485f58;
        if ((bVar12 == 0x2a) || (bVar12 == 0x2f)) goto LAB_00485e09;
      }
      else if (bVar12 < 0x3d) {
        if (bVar12 == 0x3b) goto LAB_00485e09;
      }
      else if ((bVar12 - 0x7b < 3) || (bVar12 == 0x3d)) goto LAB_00485e09;
    }
  }
  else if (bVar12 < 0x3e) {
    if (bVar12 != 0x3c) goto LAB_00485e09;
  }
  else if ((byte)(bVar12 + 0x85) < 3) goto LAB_00485e09;
LAB_00485f0c:
  bVar12 = pbVar18[1];
  pbVar19 = pbVar18 + 1;
  goto LAB_00485f15;
  while( true ) {
    iVar8 = this->StringLen;
    if (iVar8 == 0x80) {
      FString::AppendCStrPart(this_00,this->StringBuffer,0x80);
      this->StringLen = 0;
      iVar8 = 0;
    }
    bVar12 = *pbVar20;
    this->StringLen = iVar8 + 1;
    this->StringBuffer[iVar8] = bVar12;
    pbVar20 = pbVar20 + 1;
    if (pbVar2 <= pbVar20) break;
LAB_004816f1:
    bVar12 = *pbVar20;
    if ((this->Escape == true) && (bVar12 == 0x5c)) {
      if (pbVar20[1] == 0x22) {
        pbVar20 = pbVar20 + 1;
      }
    }
    else if (bVar12 == 10) {
LAB_00481730:
      if (this->CMode == true) {
        if (this->Escape != false) {
          iVar8 = this->StringLen;
          if (((long)iVar8 != 0) && (this->String[(long)iVar8 + -1] == '\\')) {
            this->StringLen = iVar8 + -1;
            goto LAB_00481768;
          }
        }
        ScriptError(this,"Unterminated string constant");
      }
LAB_00481768:
      this->Line = this->Line + 1;
      this->Crossed = true;
    }
    else if (bVar12 == 0xd) {
      if (pbVar20[1] == 10) {
        pbVar20 = pbVar20 + 1;
        goto LAB_00481730;
      }
    }
    else if (bVar12 == 0x22) break;
  }
  iVar8 = this->StringLen;
LAB_004817b0:
  if (iVar8 == 0x80 || *(int *)((this->BigStringBuffer).Chars + -0xc) != 0) {
    FString::AppendCStrPart(this_00,this->StringBuffer,(long)iVar8);
    pcVar11 = FString::LockBuffer(this_00);
    this->String = pcVar11;
    this->StringLen = *(int *)((this->BigStringBuffer).Chars + -0xc);
  }
  else {
    this->String = this->StringBuffer;
    this->StringBuffer[iVar8] = '\0';
  }
  this->ScriptPtr = (char *)(pbVar20 + 1);
  goto LAB_00485edf;
LAB_00480e49:
  do {
    pbVar18 = pbVar19 + 1;
    pbVar19 = pbVar19 + 1;
    bVar12 = *pbVar18;
    while (bVar12 == 0x5c) {
      while (pbVar18 = pbVar19 + 1, *pbVar18 != 0x22) {
        pbVar19 = pbVar19 + 1;
        if (*pbVar18 != 0x5c) goto LAB_00480e49;
      }
      pbVar18 = pbVar19 + 2;
      pbVar19 = pbVar19 + 2;
      bVar12 = *pbVar18;
    }
  } while (bVar12 != 0x22);
LAB_00480e77:
  this->TokenType = 0x102;
  pbVar19 = pbVar19 + 1;
  goto LAB_00485e09;
LAB_00485cfa:
  bVar5 = false;
  bVar22 = true;
  bVar23 = true;
  bVar3 = true;
LAB_00485cfd:
  bVar4 = false;
LAB_00485d00:
  pbVar18 = pbVar19;
  if (0x2f < bVar12) {
    if (bVar12 < 0x3c) {
joined_r0x004811c6:
      if (bVar12 < 0x3a) goto LAB_00485ce9;
      goto LAB_00485d3a;
    }
joined_r0x0048110f:
    if (bVar12 == 0x7d) goto LAB_00485d3a;
LAB_00485ce9:
    bVar12 = pbVar18[1];
    pbVar19 = pbVar18 + 1;
    goto LAB_00485cfa;
  }
  if (bVar12 < 0x22) {
joined_r0x004810fe:
    if (bVar12 == 0x21) goto LAB_00485ce9;
    goto LAB_00485d3a;
  }
  if (bVar12 != 0x2f) {
    if (bVar12 != 0x22) goto LAB_00485ce9;
    goto LAB_00485d3a;
  }
  pbVar18 = pbVar19 + 1;
  bVar12 = pbVar19[1];
  if (bVar12 < 0x2f) {
    if (bVar12 < 0x23) {
      if (bVar12 == 0x21) goto LAB_00485ce9;
    }
    else if (bVar12 != 0x2a) goto LAB_00485ce9;
  }
  else if (bVar12 < 0x3c) {
    if ((bVar12 != 0x2f) && (bVar12 < 0x3a)) goto LAB_00485ce9;
  }
  else if (bVar12 != 0x7d) goto LAB_00485ce9;
  if (!bVar22) {
    if (bVar23) {
      if (bVar5) {
LAB_00485da8:
        this->TokenType = 0x182;
      }
      else {
LAB_00485dba:
        this->TokenType = 0x176;
      }
    }
    else {
LAB_00485db1:
      this->TokenType = 0x184;
    }
    goto LAB_00485e09;
  }
  if (bVar3) {
LAB_00485d3a:
    this->TokenType = 0x107;
  }
  else if (bVar4) {
LAB_00485d95:
    this->TokenType = 0x183;
  }
  else {
LAB_00485dc3:
    this->StateMode = '\0';
    this->StateOptions = false;
    this->TokenType = 0x14d;
  }
  goto LAB_00485e09;
switchD_004813bb_caseD_48:
  bVar12 = pbVar20[2];
  if ((bVar12 & 0xdf) != 0x4f) {
LAB_004839e6:
    pbVar19 = pbVar20 + 2;
    goto switchD_004813bb_caseD_4a;
  }
  bVar12 = pbVar20[3];
  if ((bVar12 & 0xdf) != 0x52) {
LAB_004846f5:
    pbVar19 = pbVar20 + 3;
    goto switchD_004813bb_caseD_4a;
  }
  bVar12 = pbVar20[4];
  if ((bVar12 & 0xdf) != 0x54) {
LAB_00485073:
    pbVar19 = pbVar20 + 4;
    goto switchD_004813bb_caseD_4a;
  }
  pbVar19 = pbVar20 + 5;
  bVar12 = pbVar20[5];
  if (bVar12 < 0x5b) {
    bVar23 = 0x2f < bVar12;
    bVar22 = (byte)(bVar12 + 0xbf) < 0xf9;
  }
  else {
    if (bVar12 < 0x60) {
      iVar16 = 0x13a;
      goto joined_r0x004855f0;
    }
    bVar23 = bVar12 != 0x60;
    bVar22 = bVar12 < 0x7b;
  }
  iVar16 = 0x13a;
  goto LAB_00485c16;
LAB_00485dd5:
  bVar12 = pbVar19[1];
  pbVar19 = pbVar19 + 1;
switchD_004813bb_caseD_4a:
  if (bVar12 < 0x5b) {
    if ((bVar12 < 0x30) || ((byte)(bVar12 - 0x3a) < 7)) goto LAB_00485e02;
    goto LAB_00485dd5;
  }
  if (bVar12 < 0x60) {
    if (bVar12 != 0x5f) goto LAB_00485e02;
  }
  else if ((bVar12 == 0x60) || (0x7a < bVar12)) goto LAB_00485e02;
  goto LAB_00485dd5;
LAB_00485e02:
  this->TokenType = 0x101;
  goto LAB_00485e09;
  while( true ) {
    if (0x39 < bVar12) {
      if (bVar12 == 0x45) goto LAB_004816a3;
      goto LAB_004810ea;
    }
    if (bVar12 == 0x2e) goto LAB_0048112c;
    if (bVar12 < 0x30) break;
LAB_00480ead:
    pbVar19 = pbVar19 + 1;
    bVar12 = *pbVar19;
    if (0x4c < bVar12) {
      if (bVar12 < 0x66) {
        if (bVar12 != 0x65) goto LAB_004810c7;
LAB_004816a3:
        bVar23 = true;
        goto LAB_00482956;
      }
      if (0x6c < bVar12) goto LAB_00482f20;
      pbVar18 = pbVar19;
      if (bVar12 == 0x6c) goto LAB_004843aa;
      break;
    }
  }
LAB_004843c8:
  this->TokenType = 0x104;
  goto LAB_00485e09;
LAB_004810c7:
  pbVar18 = pbVar19;
  if (bVar12 == 0x55) goto LAB_004843aa;
  goto LAB_004843c8;
LAB_0048436a:
  bVar12 = *pbVar19;
  if (bVar12 < 0x55) {
    if (bVar12 < 0x41) {
      if (9 < (byte)(bVar12 - 0x30)) goto LAB_004843c8;
    }
    else if (0x46 < bVar12) goto LAB_004810ea;
  }
  else {
    if (0x6b < bVar12) goto LAB_00482f14;
    pbVar18 = pbVar19;
    if (bVar12 == 0x55) goto LAB_004843aa;
    if (5 < (byte)(bVar12 + 0x9f)) goto LAB_004843c8;
  }
  pbVar19 = pbVar19 + 1;
  goto LAB_0048436a;
LAB_004810ea:
  pbVar18 = pbVar19;
  if (bVar12 == 0x4c) goto LAB_004843aa;
  goto LAB_004843c8;
LAB_00482f14:
  pbVar18 = pbVar19;
  if (bVar12 != 0x6c) {
LAB_00482f20:
    pbVar18 = pbVar19;
    if (bVar12 != 0x75) goto LAB_004843c8;
  }
LAB_004843aa:
  pbVar19 = pbVar18 + 1;
  bVar12 = pbVar18[1];
  if (bVar12 < 0x56) {
    if ((bVar12 == 0x4c) || (bVar12 == 0x55)) goto LAB_004843c1;
  }
  else if (bVar12 < 0x6d) {
    if (bVar12 == 0x6c) {
LAB_004843c1:
      pbVar19 = pbVar18 + 2;
    }
  }
  else if (bVar12 == 0x75) goto LAB_004843c1;
  goto LAB_004843c8;
code_r0x00482997:
  if (9 < (byte)(bVar12 - 0x30)) goto LAB_00482ab7;
  goto LAB_0048298c;
LAB_00480c4c:
  pbVar19 = (byte *)this->ScriptEndPtr;
LAB_00480c50:
  this->ScriptPtr = (char *)pbVar19;
  lVar14 = 0xe8;
LAB_00480bf9:
  bVar23 = false;
  goto LAB_00485ee6;
  while( true ) {
    if (bVar12 < 0x30) goto LAB_00482ab7;
    if (0x39 < bVar12) break;
LAB_0048112c:
    pbVar19 = pbVar19 + 1;
    bVar12 = *pbVar19;
    if (0x45 < bVar12) {
      if (bVar12 < 0x65) goto joined_r0x00482141;
      if (bVar12 == 0x65) goto LAB_00482954;
      if (0x66 < bVar12) goto LAB_00482ab7;
      goto LAB_00482ab4;
    }
  }
  if (bVar12 == 0x45) {
LAB_00482954:
    bVar23 = false;
LAB_00482956:
    bVar12 = pbVar19[1];
    if (bVar12 < 0x2d) {
      if (bVar12 == 0x2b) {
LAB_0048296a:
        if (0xf5 < (byte)(pbVar19[2] - 0x3a)) {
          pbVar19 = pbVar19 + 2;
LAB_0048298c:
          pbVar19 = pbVar19 + 1;
          bVar12 = *pbVar19;
          if (bVar12 < 0x46) goto code_r0x00482997;
          bVar12 = bVar12 & 0xdf;
joined_r0x00482141:
          if (bVar12 == 0x46) {
LAB_00482ab4:
            pbVar19 = pbVar19 + 1;
          }
          goto LAB_00482ab7;
        }
      }
    }
    else {
      if (bVar12 == 0x2d) goto LAB_0048296a;
      if ((byte)(bVar12 - 0x30) < 10) {
        pbVar19 = pbVar19 + 1;
        goto LAB_0048298c;
      }
    }
    if (bVar23) goto LAB_004843c8;
  }
LAB_00482ab7:
  this->TokenType = 0x106;
LAB_00485e09:
  if (pbVar2 <= pbVar19) {
    pbVar19 = (byte *)this->ScriptEndPtr;
  }
  this->ScriptPtr = (char *)pbVar19;
  uVar9 = (int)pbVar19 - iVar8;
  this->StringLen = uVar9;
  if (tokens) {
LAB_00485e29:
    uVar21 = this->TokenType;
    if ((uVar21 & 0xfffffffe) != 0x102) goto LAB_00485c7a;
    uVar1 = uVar9 - 2;
    this->StringLen = uVar1;
    if ((int)uVar9 < 0x82) {
      memcpy(this->StringBuffer,pbVar20 + 1,(long)(int)uVar1);
    }
    else {
      FString::FString(&FStack_38,(char *)(pbVar20 + 1),(ulong)uVar1);
      FString::operator=(&this->BigStringBuffer,&FStack_38);
      FString::~FString(&FStack_38);
      uVar21 = this->TokenType;
    }
    BVar6 = this->StateMode;
    if ((BVar6 == '\0') || (uVar21 != 0x102)) goto LAB_00485cc8;
    this->TokenType = 0x107;
LAB_00485eae:
    BVar7 = BVar6 + 0xff;
LAB_00485eb2:
    this->StateMode = BVar7;
  }
  else {
LAB_00485c7a:
    if ((int)uVar9 < 0x80) {
      memcpy(this->StringBuffer,pbVar20,(long)(int)uVar9);
    }
    else {
      FString::FString(&FStack_38,(char *)pbVar20,(ulong)uVar9);
      FString::operator=(&this->BigStringBuffer,&FStack_38);
      FString::~FString(&FStack_38);
    }
    if (tokens) {
      BVar6 = this->StateMode;
LAB_00485cc8:
      if (BVar6 != '\0') {
        BVar7 = '\x02';
        if (this->TokenType == 0x107) goto LAB_00485eae;
        goto LAB_00485eb2;
      }
    }
  }
  if ((long)this->StringLen < 0x80) {
    this->String = this->StringBuffer;
    this->StringBuffer[this->StringLen] = '\0';
  }
  else {
    pcVar11 = FString::LockBuffer(&this->BigStringBuffer);
    this->String = pcVar11;
  }
LAB_00485edf:
  bVar23 = true;
  lVar14 = 0xe8;
LAB_00485ee6:
  this->StringBuffer[lVar14 + -0x58] = tokens;
  return bVar23;
}

Assistant:

bool FScanner::ScanString (bool tokens)
{
	const char *marker, *tok;
	bool return_val;

	CheckOpen();
	if (AlreadyGot)
	{
		AlreadyGot = false;
		if (!tokens || LastGotToken)
		{
			return true;
		}
		ScriptPtr = LastGotPtr;
		Line = LastGotLine;
	}

	Crossed = false;
	if (ScriptPtr >= ScriptEndPtr)
	{
		End = true;
		return false;
	}

	LastGotPtr = ScriptPtr;
	LastGotLine = Line;

	// In case the generated scanner does not use marker, avoid compiler warnings.
	marker;
#include "sc_man_scanner.h"
	LastGotToken = tokens;
	return return_val;
}